

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  long lVar9;
  RTCRayQueryContext *pRVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  ulong uVar70;
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  ulong uVar76;
  ulong uVar77;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar78;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  byte bVar83;
  bool bVar84;
  float fVar85;
  float fVar115;
  float fVar117;
  __m128 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar86;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar119;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar124;
  float fVar154;
  float fVar155;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar156;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar157;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar181;
  float fVar182;
  float fVar186;
  float fVar188;
  float fVar190;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar184;
  undefined1 auVar173 [32];
  float fVar183;
  float fVar185;
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [28];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar238;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar240;
  undefined1 auVar242 [16];
  float fVar241;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [28];
  float fVar265;
  float fVar267;
  float fVar271;
  float fVar273;
  undefined1 auVar251 [32];
  float fVar269;
  float fVar275;
  undefined1 auVar252 [32];
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar272;
  float fVar274;
  float fVar276;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar292;
  float fVar296;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [28];
  float fVar304;
  float fVar308;
  undefined1 auVar285 [32];
  float fVar300;
  float fVar312;
  undefined1 auVar286 [32];
  float fVar293;
  float fVar294;
  float fVar297;
  float fVar298;
  float fVar301;
  float fVar302;
  float fVar305;
  float fVar306;
  float fVar309;
  float fVar310;
  float fVar313;
  float fVar314;
  float fVar316;
  undefined1 auVar287 [32];
  float fVar295;
  float fVar299;
  float fVar303;
  float fVar307;
  float fVar311;
  float fVar315;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  undefined1 auVar338 [28];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  float fVar345;
  float fVar349;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar350;
  float fVar352;
  float fVar354;
  undefined1 auVar348 [32];
  undefined1 auVar359 [16];
  float fVar358;
  float fVar365;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar367;
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar371;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float in_register_0000151c;
  undefined1 auVar372 [32];
  float fVar382;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  float fVar383;
  float fVar384;
  undefined1 auVar385 [16];
  undefined1 auVar386 [28];
  float fVar389;
  float fVar391;
  float fVar395;
  float fVar397;
  undefined1 auVar387 [32];
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar396;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar388 [32];
  undefined1 auVar402 [16];
  float in_register_0000159c;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  float fVar407;
  float in_register_000015dc;
  undefined1 auVar406 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d04;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  float fStack_c04;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [32];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 auStack_b10 [16];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 (*local_ad0) [16];
  undefined1 (*local_ac8) [16];
  undefined1 (*local_ac0) [32];
  ulong local_ab8;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  Primitive *local_970;
  ulong local_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7d0 [16];
  RTCHitN local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar7 = prim[1];
  uVar76 = (ulong)(byte)PVar7;
  auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar127 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar214 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar127 = vsubps_avx(auVar127,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  auVar125._0_4_ = fVar214 * auVar127._0_4_;
  auVar125._4_4_ = fVar214 * auVar127._4_4_;
  auVar125._8_4_ = fVar214 * auVar127._8_4_;
  auVar125._12_4_ = fVar214 * auVar127._12_4_;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 10)));
  auVar281._0_4_ = fVar214 * auVar18._0_4_;
  auVar281._4_4_ = fVar214 * auVar18._4_4_;
  auVar281._8_4_ = fVar214 * auVar18._8_4_;
  auVar281._12_4_ = fVar214 * auVar18._12_4_;
  auVar95._16_16_ = auVar19;
  auVar95._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 10)));
  auVar169._16_16_ = auVar18;
  auVar169._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar169);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 10)));
  auVar207._16_16_ = auVar18;
  auVar207._0_16_ = auVar127;
  auVar225 = vcvtdq2ps_avx(auVar207);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 10)));
  auVar208._16_16_ = auVar18;
  auVar208._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xc + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xc + 10)));
  auVar13 = vcvtdq2ps_avx(auVar208);
  auVar251._16_16_ = auVar18;
  auVar251._0_16_ = auVar127;
  auVar14 = vcvtdq2ps_avx(auVar251);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xd + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xd + 10)));
  auVar319._16_16_ = auVar18;
  auVar319._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x12 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar319);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x12 + 10)));
  auVar320._16_16_ = auVar18;
  auVar320._0_16_ = auVar127;
  auVar16 = vcvtdq2ps_avx(auVar320);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x13 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x13 + 10)));
  auVar339._16_16_ = auVar18;
  auVar339._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x14 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x14 + 10)));
  auVar257 = vcvtdq2ps_avx(auVar339);
  auVar346._16_16_ = auVar18;
  auVar346._0_16_ = auVar127;
  auVar17 = vcvtdq2ps_avx(auVar346);
  auVar127 = vshufps_avx(auVar281,auVar281,0);
  auVar18 = vshufps_avx(auVar281,auVar281,0x55);
  auVar19 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar214 = auVar19._0_4_;
  fVar232 = auVar19._4_4_;
  fVar233 = auVar19._8_4_;
  fVar234 = auVar19._12_4_;
  fVar235 = auVar18._0_4_;
  fVar236 = auVar18._4_4_;
  fVar238 = auVar18._8_4_;
  fVar277 = auVar18._12_4_;
  fVar292 = auVar127._0_4_;
  fVar296 = auVar127._4_4_;
  fVar300 = auVar127._8_4_;
  fVar304 = auVar127._12_4_;
  auVar372._0_4_ = fVar292 * auVar95._0_4_ + fVar235 * auVar12._0_4_ + fVar214 * auVar225._0_4_;
  auVar372._4_4_ = fVar296 * auVar95._4_4_ + fVar236 * auVar12._4_4_ + fVar232 * auVar225._4_4_;
  auVar372._8_4_ = fVar300 * auVar95._8_4_ + fVar238 * auVar12._8_4_ + fVar233 * auVar225._8_4_;
  auVar372._12_4_ = fVar304 * auVar95._12_4_ + fVar277 * auVar12._12_4_ + fVar234 * auVar225._12_4_;
  auVar372._16_4_ = fVar292 * auVar95._16_4_ + fVar235 * auVar12._16_4_ + fVar214 * auVar225._16_4_;
  auVar372._20_4_ = fVar296 * auVar95._20_4_ + fVar236 * auVar12._20_4_ + fVar232 * auVar225._20_4_;
  auVar372._24_4_ = fVar300 * auVar95._24_4_ + fVar238 * auVar12._24_4_ + fVar233 * auVar225._24_4_;
  auVar372._28_4_ = fVar277 + in_register_000015dc + in_register_0000151c;
  auVar360._0_4_ = fVar292 * auVar13._0_4_ + fVar235 * auVar14._0_4_ + auVar15._0_4_ * fVar214;
  auVar360._4_4_ = fVar296 * auVar13._4_4_ + fVar236 * auVar14._4_4_ + auVar15._4_4_ * fVar232;
  auVar360._8_4_ = fVar300 * auVar13._8_4_ + fVar238 * auVar14._8_4_ + auVar15._8_4_ * fVar233;
  auVar360._12_4_ = fVar304 * auVar13._12_4_ + fVar277 * auVar14._12_4_ + auVar15._12_4_ * fVar234;
  auVar360._16_4_ = fVar292 * auVar13._16_4_ + fVar235 * auVar14._16_4_ + auVar15._16_4_ * fVar214;
  auVar360._20_4_ = fVar296 * auVar13._20_4_ + fVar236 * auVar14._20_4_ + auVar15._20_4_ * fVar232;
  auVar360._24_4_ = fVar300 * auVar13._24_4_ + fVar238 * auVar14._24_4_ + auVar15._24_4_ * fVar233;
  auVar360._28_4_ = fVar277 + in_register_000015dc + in_register_0000159c;
  auVar285._0_4_ = fVar292 * auVar16._0_4_ + fVar235 * auVar257._0_4_ + auVar17._0_4_ * fVar214;
  auVar285._4_4_ = fVar296 * auVar16._4_4_ + fVar236 * auVar257._4_4_ + auVar17._4_4_ * fVar232;
  auVar285._8_4_ = fVar300 * auVar16._8_4_ + fVar238 * auVar257._8_4_ + auVar17._8_4_ * fVar233;
  auVar285._12_4_ = fVar304 * auVar16._12_4_ + fVar277 * auVar257._12_4_ + auVar17._12_4_ * fVar234;
  auVar285._16_4_ = fVar292 * auVar16._16_4_ + fVar235 * auVar257._16_4_ + auVar17._16_4_ * fVar214;
  auVar285._20_4_ = fVar296 * auVar16._20_4_ + fVar236 * auVar257._20_4_ + auVar17._20_4_ * fVar232;
  auVar285._24_4_ = fVar300 * auVar16._24_4_ + fVar238 * auVar257._24_4_ + auVar17._24_4_ * fVar233;
  auVar285._28_4_ = fVar304 + fVar277 + fVar234;
  auVar127 = vshufps_avx(auVar125,auVar125,0);
  auVar18 = vshufps_avx(auVar125,auVar125,0x55);
  auVar19 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar232 = auVar19._0_4_;
  fVar233 = auVar19._4_4_;
  fVar234 = auVar19._8_4_;
  fVar235 = auVar19._12_4_;
  fVar296 = auVar18._0_4_;
  fVar300 = auVar18._4_4_;
  fVar304 = auVar18._8_4_;
  fVar308 = auVar18._12_4_;
  fVar236 = auVar127._0_4_;
  fVar238 = auVar127._4_4_;
  fVar277 = auVar127._8_4_;
  fVar292 = auVar127._12_4_;
  fVar214 = auVar95._28_4_;
  auVar139._0_4_ = fVar236 * auVar95._0_4_ + fVar296 * auVar12._0_4_ + fVar232 * auVar225._0_4_;
  auVar139._4_4_ = fVar238 * auVar95._4_4_ + fVar300 * auVar12._4_4_ + fVar233 * auVar225._4_4_;
  auVar139._8_4_ = fVar277 * auVar95._8_4_ + fVar304 * auVar12._8_4_ + fVar234 * auVar225._8_4_;
  auVar139._12_4_ = fVar292 * auVar95._12_4_ + fVar308 * auVar12._12_4_ + fVar235 * auVar225._12_4_;
  auVar139._16_4_ = fVar236 * auVar95._16_4_ + fVar296 * auVar12._16_4_ + fVar232 * auVar225._16_4_;
  auVar139._20_4_ = fVar238 * auVar95._20_4_ + fVar300 * auVar12._20_4_ + fVar233 * auVar225._20_4_;
  auVar139._24_4_ = fVar277 * auVar95._24_4_ + fVar304 * auVar12._24_4_ + fVar234 * auVar225._24_4_;
  auVar139._28_4_ = fVar214 + auVar12._28_4_ + auVar225._28_4_;
  auVar170._0_4_ = fVar236 * auVar13._0_4_ + auVar15._0_4_ * fVar232 + fVar296 * auVar14._0_4_;
  auVar170._4_4_ = fVar238 * auVar13._4_4_ + auVar15._4_4_ * fVar233 + fVar300 * auVar14._4_4_;
  auVar170._8_4_ = fVar277 * auVar13._8_4_ + auVar15._8_4_ * fVar234 + fVar304 * auVar14._8_4_;
  auVar170._12_4_ = fVar292 * auVar13._12_4_ + auVar15._12_4_ * fVar235 + fVar308 * auVar14._12_4_;
  auVar170._16_4_ = fVar236 * auVar13._16_4_ + auVar15._16_4_ * fVar232 + fVar296 * auVar14._16_4_;
  auVar170._20_4_ = fVar238 * auVar13._20_4_ + auVar15._20_4_ * fVar233 + fVar300 * auVar14._20_4_;
  auVar170._24_4_ = fVar277 * auVar13._24_4_ + auVar15._24_4_ * fVar234 + fVar304 * auVar14._24_4_;
  auVar170._28_4_ = fVar214 + auVar15._28_4_ + auVar225._28_4_;
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar328._16_4_ = 0x7fffffff;
  auVar328._20_4_ = 0x7fffffff;
  auVar328._24_4_ = 0x7fffffff;
  auVar328._28_4_ = 0x7fffffff;
  auVar340._8_4_ = 0x219392ef;
  auVar340._0_8_ = 0x219392ef219392ef;
  auVar340._12_4_ = 0x219392ef;
  auVar340._16_4_ = 0x219392ef;
  auVar340._20_4_ = 0x219392ef;
  auVar340._24_4_ = 0x219392ef;
  auVar340._28_4_ = 0x219392ef;
  auVar95 = vandps_avx(auVar372,auVar328);
  auVar95 = vcmpps_avx(auVar95,auVar340,1);
  auVar12 = vblendvps_avx(auVar372,auVar340,auVar95);
  auVar95 = vandps_avx(auVar360,auVar328);
  auVar95 = vcmpps_avx(auVar95,auVar340,1);
  auVar225 = vblendvps_avx(auVar360,auVar340,auVar95);
  auVar95 = vandps_avx(auVar328,auVar285);
  auVar95 = vcmpps_avx(auVar95,auVar340,1);
  auVar95 = vblendvps_avx(auVar285,auVar340,auVar95);
  auVar209._0_4_ = fVar236 * auVar16._0_4_ + fVar296 * auVar257._0_4_ + auVar17._0_4_ * fVar232;
  auVar209._4_4_ = fVar238 * auVar16._4_4_ + fVar300 * auVar257._4_4_ + auVar17._4_4_ * fVar233;
  auVar209._8_4_ = fVar277 * auVar16._8_4_ + fVar304 * auVar257._8_4_ + auVar17._8_4_ * fVar234;
  auVar209._12_4_ = fVar292 * auVar16._12_4_ + fVar308 * auVar257._12_4_ + auVar17._12_4_ * fVar235;
  auVar209._16_4_ = fVar236 * auVar16._16_4_ + fVar296 * auVar257._16_4_ + auVar17._16_4_ * fVar232;
  auVar209._20_4_ = fVar238 * auVar16._20_4_ + fVar300 * auVar257._20_4_ + auVar17._20_4_ * fVar233;
  auVar209._24_4_ = fVar277 * auVar16._24_4_ + fVar304 * auVar257._24_4_ + auVar17._24_4_ * fVar234;
  auVar209._28_4_ = fVar214 + auVar14._28_4_ + fVar235;
  auVar13 = vrcpps_avx(auVar12);
  fVar214 = auVar13._0_4_;
  fVar232 = auVar13._4_4_;
  auVar14._4_4_ = auVar12._4_4_ * fVar232;
  auVar14._0_4_ = auVar12._0_4_ * fVar214;
  fVar233 = auVar13._8_4_;
  auVar14._8_4_ = auVar12._8_4_ * fVar233;
  fVar234 = auVar13._12_4_;
  auVar14._12_4_ = auVar12._12_4_ * fVar234;
  fVar235 = auVar13._16_4_;
  auVar14._16_4_ = auVar12._16_4_ * fVar235;
  fVar236 = auVar13._20_4_;
  auVar14._20_4_ = auVar12._20_4_ * fVar236;
  fVar238 = auVar13._24_4_;
  auVar14._24_4_ = auVar12._24_4_ * fVar238;
  auVar14._28_4_ = auVar12._28_4_;
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = 0x3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar329._16_4_ = 0x3f800000;
  auVar329._20_4_ = 0x3f800000;
  auVar329._24_4_ = 0x3f800000;
  auVar329._28_4_ = 0x3f800000;
  auVar14 = vsubps_avx(auVar329,auVar14);
  auVar12 = vrcpps_avx(auVar225);
  fVar214 = fVar214 + fVar214 * auVar14._0_4_;
  fVar232 = fVar232 + fVar232 * auVar14._4_4_;
  fVar233 = fVar233 + fVar233 * auVar14._8_4_;
  fVar234 = fVar234 + fVar234 * auVar14._12_4_;
  fVar235 = fVar235 + fVar235 * auVar14._16_4_;
  fVar236 = fVar236 + fVar236 * auVar14._20_4_;
  fVar238 = fVar238 + fVar238 * auVar14._24_4_;
  fVar240 = auVar12._0_4_;
  fVar265 = auVar12._4_4_;
  auVar15._4_4_ = fVar265 * auVar225._4_4_;
  auVar15._0_4_ = fVar240 * auVar225._0_4_;
  fVar267 = auVar12._8_4_;
  auVar15._8_4_ = fVar267 * auVar225._8_4_;
  fVar269 = auVar12._12_4_;
  auVar15._12_4_ = fVar269 * auVar225._12_4_;
  fVar271 = auVar12._16_4_;
  auVar15._16_4_ = fVar271 * auVar225._16_4_;
  fVar273 = auVar12._20_4_;
  auVar15._20_4_ = fVar273 * auVar225._20_4_;
  fVar275 = auVar12._24_4_;
  auVar15._24_4_ = fVar275 * auVar225._24_4_;
  auVar15._28_4_ = auVar13._28_4_;
  auVar12 = vsubps_avx(auVar329,auVar15);
  fVar240 = fVar240 + fVar240 * auVar12._0_4_;
  fVar265 = fVar265 + fVar265 * auVar12._4_4_;
  fVar267 = fVar267 + fVar267 * auVar12._8_4_;
  fVar269 = fVar269 + fVar269 * auVar12._12_4_;
  fVar271 = fVar271 + fVar271 * auVar12._16_4_;
  fVar273 = fVar273 + fVar273 * auVar12._20_4_;
  fVar275 = fVar275 + fVar275 * auVar12._24_4_;
  auVar12 = vrcpps_avx(auVar95);
  fVar277 = auVar12._0_4_;
  fVar292 = auVar12._4_4_;
  auVar225._4_4_ = fVar292 * auVar95._4_4_;
  auVar225._0_4_ = fVar277 * auVar95._0_4_;
  fVar296 = auVar12._8_4_;
  auVar225._8_4_ = fVar296 * auVar95._8_4_;
  fVar300 = auVar12._12_4_;
  auVar225._12_4_ = fVar300 * auVar95._12_4_;
  fVar304 = auVar12._16_4_;
  auVar225._16_4_ = fVar304 * auVar95._16_4_;
  fVar308 = auVar12._20_4_;
  auVar225._20_4_ = fVar308 * auVar95._20_4_;
  fVar312 = auVar12._24_4_;
  auVar225._24_4_ = fVar312 * auVar95._24_4_;
  auVar225._28_4_ = auVar95._28_4_;
  auVar95 = vsubps_avx(auVar329,auVar225);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar127 = vpmovsxwd_avx(auVar127);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar76 * 7 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar18);
  fVar277 = fVar277 + fVar277 * auVar95._0_4_;
  fVar292 = fVar292 + fVar292 * auVar95._4_4_;
  fVar296 = fVar296 + fVar296 * auVar95._8_4_;
  fVar300 = fVar300 + fVar300 * auVar95._12_4_;
  fVar304 = fVar304 + fVar304 * auVar95._16_4_;
  fVar308 = fVar308 + fVar308 * auVar95._20_4_;
  fVar312 = fVar312 + fVar312 * auVar95._24_4_;
  auVar96._16_16_ = auVar18;
  auVar96._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar95 = vsubps_avx(auVar95,auVar139);
  auVar92._0_4_ = fVar214 * auVar95._0_4_;
  auVar92._4_4_ = fVar232 * auVar95._4_4_;
  auVar92._8_4_ = fVar233 * auVar95._8_4_;
  auVar92._12_4_ = fVar234 * auVar95._12_4_;
  auVar13._16_4_ = fVar235 * auVar95._16_4_;
  auVar13._0_16_ = auVar92;
  auVar13._20_4_ = fVar236 * auVar95._20_4_;
  auVar13._24_4_ = fVar238 * auVar95._24_4_;
  auVar13._28_4_ = auVar95._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar127 = vpmovsxwd_avx(auVar19);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar76 * 9 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar243);
  auVar321._16_16_ = auVar18;
  auVar321._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar321);
  auVar95 = vsubps_avx(auVar95,auVar139);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar76 * 0xe + 6);
  auVar127 = vpmovsxwd_avx(auVar162);
  auVar126._0_4_ = fVar214 * auVar95._0_4_;
  auVar126._4_4_ = fVar232 * auVar95._4_4_;
  auVar126._8_4_ = fVar233 * auVar95._8_4_;
  auVar126._12_4_ = fVar234 * auVar95._12_4_;
  auVar16._16_4_ = fVar235 * auVar95._16_4_;
  auVar16._0_16_ = auVar126;
  auVar16._20_4_ = fVar236 * auVar95._20_4_;
  auVar16._24_4_ = fVar238 * auVar95._24_4_;
  auVar16._28_4_ = auVar95._28_4_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar76 * 0xe + 0xe);
  auVar18 = vpmovsxwd_avx(auVar3);
  auVar222._16_16_ = auVar18;
  auVar222._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar222);
  auVar95 = vsubps_avx(auVar95,auVar170);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar127 = vpmovsxwd_avx(auVar90);
  auVar215._0_4_ = fVar240 * auVar95._0_4_;
  auVar215._4_4_ = fVar265 * auVar95._4_4_;
  auVar215._8_4_ = fVar267 * auVar95._8_4_;
  auVar215._12_4_ = fVar269 * auVar95._12_4_;
  auVar257._16_4_ = fVar271 * auVar95._16_4_;
  auVar257._0_16_ = auVar215;
  auVar257._20_4_ = fVar273 * auVar95._20_4_;
  auVar257._24_4_ = fVar275 * auVar95._24_4_;
  auVar257._28_4_ = auVar95._28_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar159);
  auVar322._16_16_ = auVar18;
  auVar322._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar322);
  auVar95 = vsubps_avx(auVar95,auVar170);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar76 * 0x15 + 6);
  auVar127 = vpmovsxwd_avx(auVar196);
  auVar158._0_4_ = fVar240 * auVar95._0_4_;
  auVar158._4_4_ = fVar265 * auVar95._4_4_;
  auVar158._8_4_ = fVar267 * auVar95._8_4_;
  auVar158._12_4_ = fVar269 * auVar95._12_4_;
  auVar17._16_4_ = fVar271 * auVar95._16_4_;
  auVar17._0_16_ = auVar158;
  auVar17._20_4_ = fVar273 * auVar95._20_4_;
  auVar17._24_4_ = fVar275 * auVar95._24_4_;
  auVar17._28_4_ = auVar95._28_4_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar76 * 0x15 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar4);
  auVar252._16_16_ = auVar18;
  auVar252._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar252);
  auVar95 = vsubps_avx(auVar95,auVar209);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar127 = vpmovsxwd_avx(auVar5);
  auVar242._0_4_ = fVar277 * auVar95._0_4_;
  auVar242._4_4_ = fVar292 * auVar95._4_4_;
  auVar242._8_4_ = fVar296 * auVar95._8_4_;
  auVar242._12_4_ = fVar300 * auVar95._12_4_;
  auVar20._16_4_ = fVar304 * auVar95._16_4_;
  auVar20._0_16_ = auVar242;
  auVar20._20_4_ = fVar308 * auVar95._20_4_;
  auVar20._24_4_ = fVar312 * auVar95._24_4_;
  auVar20._28_4_ = auVar95._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar6);
  auVar323._16_16_ = auVar18;
  auVar323._0_16_ = auVar127;
  auVar95 = vcvtdq2ps_avx(auVar323);
  auVar95 = vsubps_avx(auVar95,auVar209);
  auVar192._0_4_ = fVar277 * auVar95._0_4_;
  auVar192._4_4_ = fVar292 * auVar95._4_4_;
  auVar192._8_4_ = fVar296 * auVar95._8_4_;
  auVar192._12_4_ = fVar300 * auVar95._12_4_;
  auVar226._16_4_ = fVar304 * auVar95._16_4_;
  auVar226._0_16_ = auVar192;
  auVar226._20_4_ = fVar308 * auVar95._20_4_;
  auVar226._24_4_ = fVar312 * auVar95._24_4_;
  auVar226._28_4_ = auVar95._28_4_;
  auVar127 = vpminsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpminsd_avx(auVar92,auVar126);
  auVar330._16_16_ = auVar127;
  auVar330._0_16_ = auVar18;
  auVar127 = vpminsd_avx(auVar257._16_16_,auVar17._16_16_);
  auVar18 = vpminsd_avx(auVar215,auVar158);
  auVar341._16_16_ = auVar127;
  auVar341._0_16_ = auVar18;
  auVar95 = vmaxps_avx(auVar330,auVar341);
  auVar127 = vpminsd_avx(auVar20._16_16_,auVar226._16_16_);
  auVar18 = vpminsd_avx(auVar242,auVar192);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar406._4_4_ = uVar2;
  auVar406._0_4_ = uVar2;
  auVar406._8_4_ = uVar2;
  auVar406._12_4_ = uVar2;
  auVar406._16_4_ = uVar2;
  auVar406._20_4_ = uVar2;
  auVar406._24_4_ = uVar2;
  auVar406._28_4_ = uVar2;
  auVar387._16_16_ = auVar127;
  auVar387._0_16_ = auVar18;
  auVar12 = vmaxps_avx(auVar387,auVar406);
  auVar95 = vmaxps_avx(auVar95,auVar12);
  local_460._4_4_ = auVar95._4_4_ * 0.99999964;
  local_460._0_4_ = auVar95._0_4_ * 0.99999964;
  local_460._8_4_ = auVar95._8_4_ * 0.99999964;
  local_460._12_4_ = auVar95._12_4_ * 0.99999964;
  local_460._16_4_ = auVar95._16_4_ * 0.99999964;
  local_460._20_4_ = auVar95._20_4_ * 0.99999964;
  local_460._24_4_ = auVar95._24_4_ * 0.99999964;
  local_460._28_4_ = auVar95._28_4_;
  auVar127 = vpmaxsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpmaxsd_avx(auVar92,auVar126);
  auVar97._16_16_ = auVar127;
  auVar97._0_16_ = auVar18;
  auVar127 = vpmaxsd_avx(auVar257._16_16_,auVar17._16_16_);
  auVar18 = vpmaxsd_avx(auVar215,auVar158);
  auVar140._16_16_ = auVar127;
  auVar140._0_16_ = auVar18;
  auVar95 = vminps_avx(auVar97,auVar140);
  auVar127 = vpmaxsd_avx(auVar20._16_16_,auVar226._16_16_);
  auVar18 = vpmaxsd_avx(auVar242,auVar192);
  auVar141._16_16_ = auVar127;
  auVar141._0_16_ = auVar18;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar171._4_4_ = uVar2;
  auVar171._0_4_ = uVar2;
  auVar171._8_4_ = uVar2;
  auVar171._12_4_ = uVar2;
  auVar171._16_4_ = uVar2;
  auVar171._20_4_ = uVar2;
  auVar171._24_4_ = uVar2;
  auVar171._28_4_ = uVar2;
  auVar12 = vminps_avx(auVar141,auVar171);
  auVar95 = vminps_avx(auVar95,auVar12);
  auVar12._4_4_ = auVar95._4_4_ * 1.0000004;
  auVar12._0_4_ = auVar95._0_4_ * 1.0000004;
  auVar12._8_4_ = auVar95._8_4_ * 1.0000004;
  auVar12._12_4_ = auVar95._12_4_ * 1.0000004;
  auVar12._16_4_ = auVar95._16_4_ * 1.0000004;
  auVar12._20_4_ = auVar95._20_4_ * 1.0000004;
  auVar12._24_4_ = auVar95._24_4_ * 1.0000004;
  auVar12._28_4_ = auVar95._28_4_;
  auVar95 = vcmpps_avx(local_460,auVar12,2);
  auVar127 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar142._16_16_ = auVar127;
  auVar142._0_16_ = auVar127;
  auVar12 = vcvtdq2ps_avx(auVar142);
  auVar12 = vcmpps_avx(_DAT_01f7b060,auVar12,1);
  auVar95 = vandps_avx(auVar95,auVar12);
  uVar81 = vmovmskps_avx(auVar95);
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_5a0 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  uVar80 = 1 << ((byte)k & 0x1f);
  local_ac0 = (undefined1 (*) [32])&local_6e0;
  local_ac8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar80 & 0xf) << 4));
  local_ad0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar80 >> 4) * 0x10);
  local_970 = prim;
LAB_009dd975:
  local_968 = (ulong)uVar81;
  if (local_968 == 0) {
LAB_009e0382:
    return local_968 != 0;
  }
  lVar78 = 0;
  if (local_968 != 0) {
    for (; (uVar81 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
    }
  }
  local_ab8 = (ulong)*(uint *)(local_970 + 2);
  pGVar8 = (context->scene->geometries).items[local_ab8].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_970 + lVar78 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar127 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar76);
  auVar18 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * (uVar76 + 1));
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar243 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar214 = *(float *)(ray + k * 4 + 0x80);
  auVar359._4_4_ = fVar214;
  auVar359._0_4_ = fVar214;
  auVar359._8_4_ = fVar214;
  auVar359._12_4_ = fVar214;
  fStack_870 = fVar214;
  _local_880 = auVar359;
  fStack_86c = fVar214;
  fStack_868 = fVar214;
  fStack_864 = fVar214;
  fVar232 = *(float *)(ray + k * 4 + 0xa0);
  auVar385._4_4_ = fVar232;
  auVar385._0_4_ = fVar232;
  auVar385._8_4_ = fVar232;
  auVar385._12_4_ = fVar232;
  fStack_8f0 = fVar232;
  _local_900 = auVar385;
  fStack_8ec = fVar232;
  fStack_8e8 = fVar232;
  fStack_8e4 = fVar232;
  auVar19 = vunpcklps_avx(auVar359,auVar385);
  fVar233 = *(float *)(ray + k * 4 + 0xc0);
  auVar402._4_4_ = fVar233;
  auVar402._0_4_ = fVar233;
  auVar402._8_4_ = fVar233;
  auVar402._12_4_ = fVar233;
  fStack_890 = fVar233;
  _local_8a0 = auVar402;
  fStack_88c = fVar233;
  fStack_888 = fVar233;
  fStack_884 = fVar233;
  _local_a10 = vinsertps_avx(auVar19,auVar402,0x28);
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + uVar76 * (long)pGVar8[2].pointQueryFunc);
  auVar216._0_4_ = auVar127._0_4_ + *pfVar1 * 0.33333334;
  auVar216._4_4_ = auVar127._4_4_ + pfVar1[1] * 0.33333334;
  auVar216._8_4_ = auVar127._8_4_ + pfVar1[2] * 0.33333334;
  auVar216._12_4_ = auVar127._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * (uVar76 + 1));
  auVar87._0_4_ = *pfVar1 * 0.33333334;
  auVar87._4_4_ = pfVar1[1] * 0.33333334;
  auVar87._8_4_ = pfVar1[2] * 0.33333334;
  auVar87._12_4_ = pfVar1[3] * 0.33333334;
  auVar3 = vsubps_avx(auVar18,auVar87);
  auVar88._0_4_ = (auVar18._0_4_ + auVar127._0_4_ + auVar216._0_4_ + auVar3._0_4_) * 0.25;
  auVar88._4_4_ = (auVar18._4_4_ + auVar127._4_4_ + auVar216._4_4_ + auVar3._4_4_) * 0.25;
  auVar88._8_4_ = (auVar18._8_4_ + auVar127._8_4_ + auVar216._8_4_ + auVar3._8_4_) * 0.25;
  auVar88._12_4_ = (auVar18._12_4_ + auVar127._12_4_ + auVar216._12_4_ + auVar3._12_4_) * 0.25;
  auVar19 = vsubps_avx(auVar88,auVar243);
  auVar19 = vdpps_avx(auVar19,_local_a10,0x7f);
  local_a20 = vdpps_avx(_local_a10,_local_a10,0x7f);
  auVar162 = vrcpss_avx(local_a20,local_a20);
  fVar234 = auVar19._0_4_ * auVar162._0_4_ * (2.0 - local_a20._0_4_ * auVar162._0_4_);
  auVar162 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
  auVar193._0_4_ = auVar243._0_4_ + local_a10._0_4_ * auVar162._0_4_;
  auVar193._4_4_ = auVar243._4_4_ + local_a10._4_4_ * auVar162._4_4_;
  auVar193._8_4_ = auVar243._8_4_ + local_a10._8_4_ * auVar162._8_4_;
  auVar193._12_4_ = auVar243._12_4_ + local_a10._12_4_ * auVar162._12_4_;
  auVar19 = vblendps_avx(auVar193,_DAT_01f45a50,8);
  _local_b50 = vsubps_avx(auVar127,auVar19);
  _local_b60 = vsubps_avx(auVar3,auVar19);
  _local_b70 = vsubps_avx(auVar216,auVar19);
  _local_b80 = vsubps_avx(auVar18,auVar19);
  auVar127 = vshufps_avx(_local_b50,_local_b50,0);
  local_380._16_16_ = auVar127;
  local_380._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b50,_local_b50,0x55);
  local_3a0._16_16_ = auVar127;
  local_3a0._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001250 = auVar127;
  _local_1e0 = auVar127;
  auVar127 = vshufps_avx(_local_b50,_local_b50,0xff);
  local_3c0._16_16_ = auVar127;
  local_3c0._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0);
  local_3e0._16_16_ = auVar127;
  local_3e0._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0x55);
  auVar286._16_16_ = auVar127;
  auVar286._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0xaa);
  local_a40._16_16_ = auVar127;
  local_a40._0_16_ = auVar127;
  auVar18 = vshufps_avx(_local_b70,_local_b70,0xff);
  auVar127 = vshufps_avx(_local_b60,_local_b60,0);
  local_400._16_16_ = auVar127;
  local_400._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0x55);
  local_420._16_16_ = auVar127;
  local_420._0_16_ = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar127;
  _local_200 = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0xff);
  auVar291 = ZEXT3264(local_a40);
  register0x00001290 = auVar127;
  _local_220 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar127;
  _local_240 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar127;
  _local_260 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar127;
  _local_280 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xff);
  register0x00001290 = auVar127;
  _local_2a0 = auVar127;
  auVar127 = ZEXT416((uint)(fVar214 * fVar214 + fVar232 * fVar232 + fVar233 * fVar233));
  auVar127 = vshufps_avx(auVar127,auVar127,0);
  local_2c0._16_16_ = auVar127;
  local_2c0._0_16_ = auVar127;
  fVar214 = *(float *)(ray + k * 4 + 0x60);
  local_980 = ZEXT416((uint)fVar234);
  auVar127 = vshufps_avx(ZEXT416((uint)(fVar214 - fVar234)),ZEXT416((uint)(fVar214 - fVar234)),0);
  local_440._16_16_ = auVar127;
  local_440._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(*(uint *)(local_970 + 2)),0);
  local_640._16_16_ = auVar127;
  local_640._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(*(uint *)(local_970 + lVar78 * 4 + 6)),0);
  local_660._16_16_ = auVar127;
  local_660._0_16_ = auVar127;
  register0x00001210 = auVar162;
  _local_960 = auVar162;
  uVar76 = 0;
  bVar83 = 0;
  local_d04 = 1;
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  local_620 = vandps_avx(local_2c0,auVar99);
  auVar127 = vsqrtss_avx(local_a20,local_a20);
  auVar19 = vsqrtss_avx(local_a20,local_a20);
  local_7d0 = ZEXT816(0x3f80000000000000);
  local_600 = auVar286;
  do {
    auVar223._8_4_ = 0x3f800000;
    auVar223._0_8_ = 0x3f8000003f800000;
    auVar223._12_4_ = 0x3f800000;
    auVar223._16_4_ = 0x3f800000;
    auVar223._20_4_ = 0x3f800000;
    auVar223._24_4_ = 0x3f800000;
    auVar223._28_4_ = 0x3f800000;
    auVar243 = vmovshdup_avx(local_7d0);
    auVar3 = vsubps_avx(auVar243,local_7d0);
    auVar243 = vshufps_avx(local_7d0,local_7d0,0);
    local_8c0._16_16_ = auVar243;
    local_8c0._0_16_ = auVar243;
    auVar162 = vshufps_avx(auVar3,auVar3,0);
    local_8e0._16_16_ = auVar162;
    local_8e0._0_16_ = auVar162;
    fVar124 = auVar162._0_4_;
    fVar154 = auVar162._4_4_;
    fVar155 = auVar162._8_4_;
    fVar156 = auVar162._12_4_;
    fVar85 = auVar243._0_4_;
    auVar143._0_4_ = fVar85 + fVar124 * 0.0;
    fVar115 = auVar243._4_4_;
    auVar143._4_4_ = fVar115 + fVar154 * 0.14285715;
    fVar117 = auVar243._8_4_;
    auVar143._8_4_ = fVar117 + fVar155 * 0.2857143;
    fVar119 = auVar243._12_4_;
    auVar143._12_4_ = fVar119 + fVar156 * 0.42857146;
    auVar143._16_4_ = fVar85 + fVar124 * 0.5714286;
    auVar143._20_4_ = fVar115 + fVar154 * 0.71428573;
    auVar143._24_4_ = fVar117 + fVar155 * 0.8571429;
    auVar143._28_4_ = fVar119 + fVar156;
    auVar95 = vsubps_avx(auVar223,auVar143);
    fVar335 = auVar18._0_4_;
    fVar349 = auVar18._4_4_;
    fVar351 = auVar18._8_4_;
    fVar353 = auVar18._12_4_;
    fVar232 = auVar95._0_4_;
    fVar233 = auVar95._4_4_;
    fVar234 = auVar95._8_4_;
    fVar235 = auVar95._12_4_;
    fVar236 = auVar95._16_4_;
    fVar238 = auVar95._20_4_;
    fVar277 = auVar95._24_4_;
    fVar292 = local_3c0._28_4_;
    fVar278 = local_400._0_4_ * auVar143._0_4_ + local_3e0._0_4_ * fVar232;
    fVar293 = local_400._4_4_ * auVar143._4_4_ + local_3e0._4_4_ * fVar233;
    fVar297 = local_400._8_4_ * auVar143._8_4_ + local_3e0._8_4_ * fVar234;
    fVar301 = local_400._12_4_ * auVar143._12_4_ + local_3e0._12_4_ * fVar235;
    fVar305 = local_400._16_4_ * auVar143._16_4_ + local_3e0._16_4_ * fVar236;
    fVar309 = local_400._20_4_ * auVar143._20_4_ + local_3e0._20_4_ * fVar238;
    fVar313 = local_400._24_4_ * auVar143._24_4_ + local_3e0._24_4_ * fVar277;
    fVar296 = local_420._0_4_ * auVar143._0_4_ + auVar286._0_4_ * fVar232;
    fVar300 = local_420._4_4_ * auVar143._4_4_ + auVar286._4_4_ * fVar233;
    fVar304 = local_420._8_4_ * auVar143._8_4_ + auVar286._8_4_ * fVar234;
    fVar308 = local_420._12_4_ * auVar143._12_4_ + auVar286._12_4_ * fVar235;
    fVar312 = local_420._16_4_ * auVar143._16_4_ + auVar286._16_4_ * fVar236;
    fVar240 = local_420._20_4_ * auVar143._20_4_ + auVar286._20_4_ * fVar238;
    fVar265 = local_420._24_4_ * auVar143._24_4_ + auVar286._24_4_ * fVar277;
    fVar267 = (float)local_200._0_4_ * auVar143._0_4_ + auVar291._0_4_ * fVar232;
    fVar269 = (float)local_200._4_4_ * auVar143._4_4_ + auVar291._4_4_ * fVar233;
    fVar271 = fStack_1f8 * auVar143._8_4_ + auVar291._8_4_ * fVar234;
    fVar273 = fStack_1f4 * auVar143._12_4_ + auVar291._12_4_ * fVar235;
    fVar275 = fStack_1f0 * auVar143._16_4_ + auVar291._16_4_ * fVar236;
    fVar237 = fStack_1ec * auVar143._20_4_ + auVar291._20_4_ * fVar238;
    fVar239 = fStack_1e8 * auVar143._24_4_ + auVar291._24_4_ * fVar277;
    fVar241 = (float)local_220._0_4_ * auVar143._0_4_ + fVar335 * fVar232;
    fVar266 = (float)local_220._4_4_ * auVar143._4_4_ + fVar349 * fVar233;
    fVar268 = fStack_218 * auVar143._8_4_ + fVar351 * fVar234;
    fVar270 = fStack_214 * auVar143._12_4_ + fVar353 * fVar235;
    fVar272 = fStack_210 * auVar143._16_4_ + fVar335 * fVar236;
    fVar274 = fStack_20c * auVar143._20_4_ + fVar349 * fVar238;
    fVar276 = fStack_208 * auVar143._24_4_ + fVar351 * fVar277;
    fVar401 = fVar292 + local_400._28_4_;
    fVar382 = auVar291._28_4_ + fVar292;
    auVar331._0_4_ =
         fVar232 * (local_3e0._0_4_ * auVar143._0_4_ + local_380._0_4_ * fVar232) +
         auVar143._0_4_ * fVar278;
    auVar331._4_4_ =
         fVar233 * (local_3e0._4_4_ * auVar143._4_4_ + local_380._4_4_ * fVar233) +
         auVar143._4_4_ * fVar293;
    auVar331._8_4_ =
         fVar234 * (local_3e0._8_4_ * auVar143._8_4_ + local_380._8_4_ * fVar234) +
         auVar143._8_4_ * fVar297;
    auVar331._12_4_ =
         fVar235 * (local_3e0._12_4_ * auVar143._12_4_ + local_380._12_4_ * fVar235) +
         auVar143._12_4_ * fVar301;
    auVar331._16_4_ =
         fVar236 * (local_3e0._16_4_ * auVar143._16_4_ + local_380._16_4_ * fVar236) +
         auVar143._16_4_ * fVar305;
    auVar331._20_4_ =
         fVar238 * (local_3e0._20_4_ * auVar143._20_4_ + local_380._20_4_ * fVar238) +
         auVar143._20_4_ * fVar309;
    auVar331._24_4_ =
         fVar277 * (local_3e0._24_4_ * auVar143._24_4_ + local_380._24_4_ * fVar277) +
         auVar143._24_4_ * fVar313;
    auVar331._28_4_ = fStack_1e4 + fVar292;
    auVar347._0_4_ =
         (auVar286._0_4_ * auVar143._0_4_ + local_3a0._0_4_ * fVar232) * fVar232 +
         auVar143._0_4_ * fVar296;
    auVar347._4_4_ =
         (auVar286._4_4_ * auVar143._4_4_ + local_3a0._4_4_ * fVar233) * fVar233 +
         auVar143._4_4_ * fVar300;
    auVar347._8_4_ =
         (auVar286._8_4_ * auVar143._8_4_ + local_3a0._8_4_ * fVar234) * fVar234 +
         auVar143._8_4_ * fVar304;
    auVar347._12_4_ =
         (auVar286._12_4_ * auVar143._12_4_ + local_3a0._12_4_ * fVar235) * fVar235 +
         auVar143._12_4_ * fVar308;
    auVar347._16_4_ =
         (auVar286._16_4_ * auVar143._16_4_ + local_3a0._16_4_ * fVar236) * fVar236 +
         auVar143._16_4_ * fVar312;
    auVar347._20_4_ =
         (auVar286._20_4_ * auVar143._20_4_ + local_3a0._20_4_ * fVar238) * fVar238 +
         auVar143._20_4_ * fVar240;
    auVar347._24_4_ =
         (auVar286._24_4_ * auVar143._24_4_ + local_3a0._24_4_ * fVar277) * fVar277 +
         auVar143._24_4_ * fVar265;
    auVar347._28_4_ = fVar353 + fVar292;
    auVar361._0_4_ =
         fVar232 * (auVar291._0_4_ * auVar143._0_4_ + fVar232 * (float)local_1e0._0_4_) +
         auVar143._0_4_ * fVar267;
    auVar361._4_4_ =
         fVar233 * (auVar291._4_4_ * auVar143._4_4_ + fVar233 * (float)local_1e0._4_4_) +
         auVar143._4_4_ * fVar269;
    auVar361._8_4_ =
         fVar234 * (auVar291._8_4_ * auVar143._8_4_ + fVar234 * fStack_1d8) +
         auVar143._8_4_ * fVar271;
    auVar361._12_4_ =
         fVar235 * (auVar291._12_4_ * auVar143._12_4_ + fVar235 * fStack_1d4) +
         auVar143._12_4_ * fVar273;
    auVar361._16_4_ =
         fVar236 * (auVar291._16_4_ * auVar143._16_4_ + fVar236 * fStack_1d0) +
         auVar143._16_4_ * fVar275;
    auVar361._20_4_ =
         fVar238 * (auVar291._20_4_ * auVar143._20_4_ + fVar238 * fStack_1cc) +
         auVar143._20_4_ * fVar237;
    auVar361._24_4_ =
         fVar277 * (auVar291._24_4_ * auVar143._24_4_ + fVar277 * fStack_1c8) +
         auVar143._24_4_ * fVar239;
    auVar361._28_4_ = fVar292 + 2.0;
    auVar324._0_4_ =
         auVar143._0_4_ * fVar241 + fVar232 * (fVar335 * auVar143._0_4_ + local_3c0._0_4_ * fVar232)
    ;
    auVar324._4_4_ =
         auVar143._4_4_ * fVar266 + fVar233 * (fVar349 * auVar143._4_4_ + local_3c0._4_4_ * fVar233)
    ;
    auVar324._8_4_ =
         auVar143._8_4_ * fVar268 + fVar234 * (fVar351 * auVar143._8_4_ + local_3c0._8_4_ * fVar234)
    ;
    auVar324._12_4_ =
         auVar143._12_4_ * fVar270 +
         fVar235 * (fVar353 * auVar143._12_4_ + local_3c0._12_4_ * fVar235);
    auVar324._16_4_ =
         auVar143._16_4_ * fVar272 +
         fVar236 * (fVar335 * auVar143._16_4_ + local_3c0._16_4_ * fVar236);
    auVar324._20_4_ =
         auVar143._20_4_ * fVar274 +
         fVar238 * (fVar349 * auVar143._20_4_ + local_3c0._20_4_ * fVar238);
    auVar324._24_4_ =
         auVar143._24_4_ * fVar276 +
         fVar277 * (fVar351 * auVar143._24_4_ + local_3c0._24_4_ * fVar277);
    auVar324._28_4_ = local_420._28_4_ + 2.0;
    auVar100._0_4_ =
         (auVar143._0_4_ * (float)local_240._0_4_ + local_400._0_4_ * fVar232) * auVar143._0_4_ +
         fVar232 * fVar278;
    auVar100._4_4_ =
         (auVar143._4_4_ * (float)local_240._4_4_ + local_400._4_4_ * fVar233) * auVar143._4_4_ +
         fVar233 * fVar293;
    auVar100._8_4_ =
         (auVar143._8_4_ * fStack_238 + local_400._8_4_ * fVar234) * auVar143._8_4_ +
         fVar234 * fVar297;
    auVar100._12_4_ =
         (auVar143._12_4_ * fStack_234 + local_400._12_4_ * fVar235) * auVar143._12_4_ +
         fVar235 * fVar301;
    auVar100._16_4_ =
         (auVar143._16_4_ * fStack_230 + local_400._16_4_ * fVar236) * auVar143._16_4_ +
         fVar236 * fVar305;
    auVar100._20_4_ =
         (auVar143._20_4_ * fStack_22c + local_400._20_4_ * fVar238) * auVar143._20_4_ +
         fVar238 * fVar309;
    auVar100._24_4_ =
         (auVar143._24_4_ * fStack_228 + local_400._24_4_ * fVar277) * auVar143._24_4_ +
         fVar277 * fVar313;
    auVar100._28_4_ = auVar291._28_4_ + 1.0 + 2.0;
    auVar210._0_4_ =
         (auVar143._0_4_ * (float)local_260._0_4_ + local_420._0_4_ * fVar232) * auVar143._0_4_ +
         fVar232 * fVar296;
    auVar210._4_4_ =
         (auVar143._4_4_ * (float)local_260._4_4_ + local_420._4_4_ * fVar233) * auVar143._4_4_ +
         fVar233 * fVar300;
    auVar210._8_4_ =
         (auVar143._8_4_ * fStack_258 + local_420._8_4_ * fVar234) * auVar143._8_4_ +
         fVar234 * fVar304;
    auVar210._12_4_ =
         (auVar143._12_4_ * fStack_254 + local_420._12_4_ * fVar235) * auVar143._12_4_ +
         fVar235 * fVar308;
    auVar210._16_4_ =
         (auVar143._16_4_ * fStack_250 + local_420._16_4_ * fVar236) * auVar143._16_4_ +
         fVar236 * fVar312;
    auVar210._20_4_ =
         (auVar143._20_4_ * fStack_24c + local_420._20_4_ * fVar238) * auVar143._20_4_ +
         fVar238 * fVar240;
    auVar210._24_4_ =
         (auVar143._24_4_ * fStack_248 + local_420._24_4_ * fVar277) * auVar143._24_4_ +
         fVar277 * fVar265;
    auVar210._28_4_ = 0x40800000;
    auVar224._0_4_ =
         (auVar143._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar232) *
         auVar143._0_4_ + fVar232 * fVar267;
    auVar224._4_4_ =
         (auVar143._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar233) *
         auVar143._4_4_ + fVar233 * fVar269;
    auVar224._8_4_ =
         (auVar143._8_4_ * fStack_278 + fStack_1f8 * fVar234) * auVar143._8_4_ + fVar234 * fVar271;
    auVar224._12_4_ =
         (auVar143._12_4_ * fStack_274 + fStack_1f4 * fVar235) * auVar143._12_4_ + fVar235 * fVar273
    ;
    auVar224._16_4_ =
         (auVar143._16_4_ * fStack_270 + fStack_1f0 * fVar236) * auVar143._16_4_ + fVar236 * fVar275
    ;
    auVar224._20_4_ =
         (auVar143._20_4_ * fStack_26c + fStack_1ec * fVar238) * auVar143._20_4_ + fVar238 * fVar237
    ;
    auVar224._24_4_ =
         (auVar143._24_4_ * fStack_268 + fStack_1e8 * fVar277) * auVar143._24_4_ + fVar277 * fVar239
    ;
    auVar224._28_4_ = fVar382 + auVar286._28_4_ + 1.0;
    auVar253._0_4_ =
         (auVar143._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar232) *
         auVar143._0_4_ + fVar232 * fVar241;
    auVar253._4_4_ =
         (auVar143._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar233) *
         auVar143._4_4_ + fVar233 * fVar266;
    auVar253._8_4_ =
         (auVar143._8_4_ * fStack_298 + fStack_218 * fVar234) * auVar143._8_4_ + fVar234 * fVar268;
    auVar253._12_4_ =
         (auVar143._12_4_ * fStack_294 + fStack_214 * fVar235) * auVar143._12_4_ + fVar235 * fVar270
    ;
    auVar253._16_4_ =
         (auVar143._16_4_ * fStack_290 + fStack_210 * fVar236) * auVar143._16_4_ + fVar236 * fVar272
    ;
    auVar253._20_4_ =
         (auVar143._20_4_ * fStack_28c + fStack_20c * fVar238) * auVar143._20_4_ + fVar238 * fVar274
    ;
    auVar253._24_4_ =
         (auVar143._24_4_ * fStack_288 + fStack_208 * fVar277) * auVar143._24_4_ + fVar277 * fVar276
    ;
    auVar253._28_4_ = fVar401 + fVar292 + auVar286._28_4_;
    fVar279 = auVar331._0_4_ * fVar232 + auVar143._0_4_ * auVar100._0_4_;
    fVar294 = auVar331._4_4_ * fVar233 + auVar143._4_4_ * auVar100._4_4_;
    fVar298 = auVar331._8_4_ * fVar234 + auVar143._8_4_ * auVar100._8_4_;
    fVar302 = auVar331._12_4_ * fVar235 + auVar143._12_4_ * auVar100._12_4_;
    fVar306 = auVar331._16_4_ * fVar236 + auVar143._16_4_ * auVar100._16_4_;
    fVar310 = auVar331._20_4_ * fVar238 + auVar143._20_4_ * auVar100._20_4_;
    fVar314 = auVar331._24_4_ * fVar277 + auVar143._24_4_ * auVar100._24_4_;
    fVar316 = fVar401 + 2.0;
    auVar403._0_4_ = auVar347._0_4_ * fVar232 + auVar143._0_4_ * auVar210._0_4_;
    auVar403._4_4_ = auVar347._4_4_ * fVar233 + auVar143._4_4_ * auVar210._4_4_;
    auVar403._8_4_ = auVar347._8_4_ * fVar234 + auVar143._8_4_ * auVar210._8_4_;
    auVar403._12_4_ = auVar347._12_4_ * fVar235 + auVar143._12_4_ * auVar210._12_4_;
    auVar403._16_4_ = auVar347._16_4_ * fVar236 + auVar143._16_4_ * auVar210._16_4_;
    auVar403._20_4_ = auVar347._20_4_ * fVar238 + auVar143._20_4_ * auVar210._20_4_;
    auVar403._24_4_ = auVar347._24_4_ * fVar277 + auVar143._24_4_ * auVar210._24_4_;
    auVar403._28_4_ = fVar382 + 2.0;
    local_2e0._0_4_ = auVar361._0_4_ * fVar232 + auVar143._0_4_ * auVar224._0_4_;
    local_2e0._4_4_ = auVar361._4_4_ * fVar233 + auVar143._4_4_ * auVar224._4_4_;
    local_2e0._8_4_ = auVar361._8_4_ * fVar234 + auVar143._8_4_ * auVar224._8_4_;
    local_2e0._12_4_ = auVar361._12_4_ * fVar235 + auVar143._12_4_ * auVar224._12_4_;
    local_2e0._16_4_ = auVar361._16_4_ * fVar236 + auVar143._16_4_ * auVar224._16_4_;
    local_2e0._20_4_ = auVar361._20_4_ * fVar238 + auVar143._20_4_ * auVar224._20_4_;
    local_2e0._24_4_ = auVar361._24_4_ * fVar277 + auVar143._24_4_ * auVar224._24_4_;
    local_2e0._28_4_ = fVar382 + 2.0;
    local_b00._0_4_ = auVar3._0_4_;
    auVar287._0_4_ = fVar232 * auVar324._0_4_ + auVar143._0_4_ * auVar253._0_4_;
    auVar287._4_4_ = fVar233 * auVar324._4_4_ + auVar143._4_4_ * auVar253._4_4_;
    auVar287._8_4_ = fVar234 * auVar324._8_4_ + auVar143._8_4_ * auVar253._8_4_;
    auVar287._12_4_ = fVar235 * auVar324._12_4_ + auVar143._12_4_ * auVar253._12_4_;
    auVar287._16_4_ = fVar236 * auVar324._16_4_ + auVar143._16_4_ * auVar253._16_4_;
    auVar287._20_4_ = fVar238 * auVar324._20_4_ + auVar143._20_4_ * auVar253._20_4_;
    auVar287._24_4_ = fVar277 * auVar324._24_4_ + auVar143._24_4_ * auVar253._24_4_;
    auVar287._28_4_ = auVar95._28_4_ + auVar143._28_4_;
    auVar95 = vsubps_avx(auVar100,auVar331);
    auVar257 = vsubps_avx(auVar210,auVar347);
    auVar12 = vsubps_avx(auVar224,auVar361);
    auVar225 = vsubps_avx(auVar253,auVar324);
    auVar243 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b00._0_4_ * 0.04761905)),0);
    fVar271 = auVar243._0_4_;
    fVar371 = fVar271 * auVar95._0_4_ * 3.0;
    fVar273 = auVar243._4_4_;
    fVar376 = fVar273 * auVar95._4_4_ * 3.0;
    auVar21._4_4_ = fVar376;
    auVar21._0_4_ = fVar371;
    fVar266 = auVar243._8_4_;
    fVar377 = fVar266 * auVar95._8_4_ * 3.0;
    auVar21._8_4_ = fVar377;
    fVar312 = auVar243._12_4_;
    fVar378 = fVar312 * auVar95._12_4_ * 3.0;
    auVar21._12_4_ = fVar378;
    fVar379 = fVar271 * auVar95._16_4_ * 3.0;
    auVar21._16_4_ = fVar379;
    fVar380 = fVar273 * auVar95._20_4_ * 3.0;
    auVar21._20_4_ = fVar380;
    fVar381 = fVar266 * auVar95._24_4_ * 3.0;
    auVar21._24_4_ = fVar381;
    auVar21._28_4_ = fVar382;
    fVar358 = fVar271 * auVar257._0_4_ * 3.0;
    fVar365 = fVar273 * auVar257._4_4_ * 3.0;
    local_9c0._4_4_ = fVar365;
    local_9c0._0_4_ = fVar358;
    fVar366 = fVar266 * auVar257._8_4_ * 3.0;
    local_9c0._8_4_ = fVar366;
    fVar367 = fVar312 * auVar257._12_4_ * 3.0;
    local_9c0._12_4_ = fVar367;
    fVar368 = fVar271 * auVar257._16_4_ * 3.0;
    local_9c0._16_4_ = fVar368;
    fVar369 = fVar273 * auVar257._20_4_ * 3.0;
    local_9c0._20_4_ = fVar369;
    fVar370 = fVar266 * auVar257._24_4_ * 3.0;
    local_9c0._24_4_ = fVar370;
    local_9c0._28_4_ = auVar361._28_4_;
    fVar383 = fVar271 * auVar12._0_4_ * 3.0;
    fVar389 = fVar273 * auVar12._4_4_ * 3.0;
    auVar22._4_4_ = fVar389;
    auVar22._0_4_ = fVar383;
    fVar391 = fVar266 * auVar12._8_4_ * 3.0;
    auVar22._8_4_ = fVar391;
    fVar393 = fVar312 * auVar12._12_4_ * 3.0;
    auVar22._12_4_ = fVar393;
    fVar395 = fVar271 * auVar12._16_4_ * 3.0;
    auVar22._16_4_ = fVar395;
    fVar397 = fVar273 * auVar12._20_4_ * 3.0;
    auVar22._20_4_ = fVar397;
    fVar399 = fVar266 * auVar12._24_4_ * 3.0;
    auVar22._24_4_ = fVar399;
    auVar22._28_4_ = fVar401;
    fVar238 = fVar271 * auVar225._0_4_ * 3.0;
    fVar277 = fVar273 * auVar225._4_4_ * 3.0;
    auVar23._4_4_ = fVar277;
    auVar23._0_4_ = fVar238;
    fVar308 = fVar266 * auVar225._8_4_ * 3.0;
    auVar23._8_4_ = fVar308;
    fVar312 = fVar312 * auVar225._12_4_ * 3.0;
    auVar23._12_4_ = fVar312;
    fVar271 = fVar271 * auVar225._16_4_ * 3.0;
    auVar23._16_4_ = fVar271;
    fVar273 = fVar273 * auVar225._20_4_ * 3.0;
    auVar23._20_4_ = fVar273;
    fVar266 = fVar266 * auVar225._24_4_ * 3.0;
    auVar23._24_4_ = fVar266;
    auVar23._28_4_ = auVar257._28_4_;
    auVar95 = vperm2f128_avx(auVar403,auVar403,1);
    auVar95 = vshufps_avx(auVar95,auVar403,0x30);
    auVar13 = vshufps_avx(auVar403,auVar95,0x29);
    auVar95 = vperm2f128_avx(local_2e0,local_2e0,1);
    auVar95 = vshufps_avx(auVar95,local_2e0,0x30);
    _local_b20 = vshufps_avx(local_2e0,auVar95,0x29);
    auVar12 = vsubps_avx(auVar287,auVar23);
    auVar95 = vperm2f128_avx(auVar12,auVar12,1);
    auVar95 = vshufps_avx(auVar95,auVar12,0x30);
    auVar14 = vshufps_avx(auVar12,auVar95,0x29);
    local_320 = vsubps_avx(auVar13,auVar403);
    local_300 = vsubps_avx(_local_b20,local_2e0);
    fVar233 = local_320._0_4_;
    fVar292 = local_320._4_4_;
    auVar24._4_4_ = fVar389 * fVar292;
    auVar24._0_4_ = fVar383 * fVar233;
    fVar240 = local_320._8_4_;
    auVar24._8_4_ = fVar391 * fVar240;
    fVar275 = local_320._12_4_;
    auVar24._12_4_ = fVar393 * fVar275;
    fVar270 = local_320._16_4_;
    auVar24._16_4_ = fVar395 * fVar270;
    fVar297 = local_320._20_4_;
    auVar24._20_4_ = fVar397 * fVar297;
    fVar349 = local_320._24_4_;
    auVar24._24_4_ = fVar399 * fVar349;
    auVar24._28_4_ = auVar12._28_4_;
    fVar234 = local_300._0_4_;
    fVar296 = local_300._4_4_;
    auVar25._4_4_ = fVar365 * fVar296;
    auVar25._0_4_ = fVar358 * fVar234;
    fVar265 = local_300._8_4_;
    auVar25._8_4_ = fVar366 * fVar265;
    fVar237 = local_300._12_4_;
    auVar25._12_4_ = fVar367 * fVar237;
    fVar272 = local_300._16_4_;
    auVar25._16_4_ = fVar368 * fVar272;
    fVar301 = local_300._20_4_;
    auVar25._20_4_ = fVar369 * fVar301;
    fVar351 = local_300._24_4_;
    auVar25._24_4_ = fVar370 * fVar351;
    auVar25._28_4_ = auVar95._28_4_;
    auVar16 = vsubps_avx(auVar25,auVar24);
    auVar71._4_4_ = fVar294;
    auVar71._0_4_ = fVar279;
    auVar71._8_4_ = fVar298;
    auVar71._12_4_ = fVar302;
    auVar71._16_4_ = fVar306;
    auVar71._20_4_ = fVar310;
    auVar71._24_4_ = fVar314;
    auVar71._28_4_ = fVar316;
    auVar95 = vperm2f128_avx(auVar71,auVar71,1);
    auVar95 = vshufps_avx(auVar95,auVar71,0x30);
    auVar15 = vshufps_avx(auVar71,auVar95,0x29);
    local_5c0 = vsubps_avx(auVar15,auVar71);
    auVar26._4_4_ = fVar376 * fVar296;
    auVar26._0_4_ = fVar371 * fVar234;
    auVar26._8_4_ = fVar377 * fVar265;
    auVar26._12_4_ = fVar378 * fVar237;
    auVar26._16_4_ = fVar379 * fVar272;
    auVar26._20_4_ = fVar380 * fVar301;
    auVar26._24_4_ = fVar381 * fVar351;
    auVar26._28_4_ = auVar15._28_4_;
    fVar235 = local_5c0._0_4_;
    fVar300 = local_5c0._4_4_;
    auVar27._4_4_ = fVar389 * fVar300;
    auVar27._0_4_ = fVar383 * fVar235;
    fVar267 = local_5c0._8_4_;
    auVar27._8_4_ = fVar391 * fVar267;
    fVar239 = local_5c0._12_4_;
    auVar27._12_4_ = fVar393 * fVar239;
    fVar274 = local_5c0._16_4_;
    auVar27._16_4_ = fVar395 * fVar274;
    fVar305 = local_5c0._20_4_;
    auVar27._20_4_ = fVar397 * fVar305;
    fVar353 = local_5c0._24_4_;
    auVar27._24_4_ = fVar399 * fVar353;
    auVar27._28_4_ = auVar331._28_4_;
    auVar17 = vsubps_avx(auVar27,auVar26);
    auVar28._4_4_ = fVar365 * fVar300;
    auVar28._0_4_ = fVar358 * fVar235;
    auVar28._8_4_ = fVar366 * fVar267;
    auVar28._12_4_ = fVar367 * fVar239;
    auVar28._16_4_ = fVar368 * fVar274;
    auVar28._20_4_ = fVar369 * fVar305;
    auVar28._24_4_ = fVar370 * fVar353;
    auVar28._28_4_ = auVar331._28_4_;
    auVar29._4_4_ = fVar376 * fVar292;
    auVar29._0_4_ = fVar371 * fVar233;
    auVar29._8_4_ = fVar377 * fVar240;
    auVar29._12_4_ = fVar378 * fVar275;
    auVar29._16_4_ = fVar379 * fVar270;
    auVar29._20_4_ = fVar380 * fVar297;
    auVar29._24_4_ = fVar381 * fVar349;
    auVar29._28_4_ = auVar347._28_4_;
    auVar20 = vsubps_avx(auVar29,auVar28);
    fVar232 = auVar20._28_4_;
    auVar211._0_4_ = fVar235 * fVar235 + fVar233 * fVar233 + fVar234 * fVar234;
    auVar211._4_4_ = fVar300 * fVar300 + fVar292 * fVar292 + fVar296 * fVar296;
    auVar211._8_4_ = fVar267 * fVar267 + fVar240 * fVar240 + fVar265 * fVar265;
    auVar211._12_4_ = fVar239 * fVar239 + fVar275 * fVar275 + fVar237 * fVar237;
    auVar211._16_4_ = fVar274 * fVar274 + fVar270 * fVar270 + fVar272 * fVar272;
    auVar211._20_4_ = fVar305 * fVar305 + fVar297 * fVar297 + fVar301 * fVar301;
    auVar211._24_4_ = fVar353 * fVar353 + fVar349 * fVar349 + fVar351 * fVar351;
    auVar211._28_4_ = fVar232 + fVar232 + auVar16._28_4_;
    auVar95 = vrcpps_avx(auVar211);
    fVar268 = auVar95._0_4_;
    fVar278 = auVar95._4_4_;
    auVar30._4_4_ = fVar278 * auVar211._4_4_;
    auVar30._0_4_ = fVar268 * auVar211._0_4_;
    fVar293 = auVar95._8_4_;
    auVar30._8_4_ = fVar293 * auVar211._8_4_;
    fVar313 = auVar95._12_4_;
    auVar30._12_4_ = fVar313 * auVar211._12_4_;
    fVar335 = auVar95._16_4_;
    auVar30._16_4_ = fVar335 * auVar211._16_4_;
    fVar336 = auVar95._20_4_;
    auVar30._20_4_ = fVar336 * auVar211._20_4_;
    fVar337 = auVar95._24_4_;
    auVar30._24_4_ = fVar337 * auVar211._24_4_;
    auVar30._28_4_ = auVar347._28_4_;
    auVar101._8_4_ = 0x3f800000;
    auVar101._0_8_ = 0x3f8000003f800000;
    auVar101._12_4_ = 0x3f800000;
    auVar101._16_4_ = 0x3f800000;
    auVar101._20_4_ = 0x3f800000;
    auVar101._24_4_ = 0x3f800000;
    auVar101._28_4_ = 0x3f800000;
    auVar226 = vsubps_avx(auVar101,auVar30);
    fVar268 = fVar268 + fVar268 * auVar226._0_4_;
    fVar278 = fVar278 + fVar278 * auVar226._4_4_;
    fVar293 = fVar293 + fVar293 * auVar226._8_4_;
    fVar313 = fVar313 + fVar313 * auVar226._12_4_;
    fVar335 = fVar335 + fVar335 * auVar226._16_4_;
    fVar336 = fVar336 + fVar336 * auVar226._20_4_;
    fVar337 = fVar337 + fVar337 * auVar226._24_4_;
    auVar12 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar12 = vshufps_avx(auVar12,local_9c0,0x30);
    auVar12 = vshufps_avx(local_9c0,auVar12,0x29);
    auVar225 = vperm2f128_avx(auVar22,auVar22,1);
    auVar225 = vshufps_avx(auVar225,auVar22,0x30);
    local_a60 = vshufps_avx(auVar22,auVar225,0x29);
    fVar86 = local_a60._0_4_;
    fVar116 = local_a60._4_4_;
    auVar31._4_4_ = fVar116 * fVar292;
    auVar31._0_4_ = fVar86 * fVar233;
    fVar118 = local_a60._8_4_;
    auVar31._8_4_ = fVar118 * fVar240;
    fVar120 = local_a60._12_4_;
    auVar31._12_4_ = fVar120 * fVar275;
    fVar121 = local_a60._16_4_;
    auVar31._16_4_ = fVar121 * fVar270;
    fVar122 = local_a60._20_4_;
    auVar31._20_4_ = fVar122 * fVar297;
    fVar123 = local_a60._24_4_;
    auVar31._24_4_ = fVar123 * fVar349;
    auVar31._28_4_ = auVar225._28_4_;
    fVar236 = auVar12._0_4_;
    fVar304 = auVar12._4_4_;
    auVar32._4_4_ = fVar296 * fVar304;
    auVar32._0_4_ = fVar234 * fVar236;
    fVar269 = auVar12._8_4_;
    auVar32._8_4_ = fVar265 * fVar269;
    fVar241 = auVar12._12_4_;
    auVar32._12_4_ = fVar237 * fVar241;
    fVar276 = auVar12._16_4_;
    auVar32._16_4_ = fVar272 * fVar276;
    fVar309 = auVar12._20_4_;
    auVar32._20_4_ = fVar301 * fVar309;
    fVar407 = auVar12._24_4_;
    auVar32._24_4_ = fVar351 * fVar407;
    auVar32._28_4_ = auVar361._28_4_;
    auVar96 = vsubps_avx(auVar32,auVar31);
    auVar12 = vperm2f128_avx(auVar21,auVar21,1);
    auVar12 = vshufps_avx(auVar12,auVar21,0x30);
    auVar225 = vshufps_avx(auVar21,auVar12,0x29);
    fVar384 = auVar225._0_4_;
    fVar390 = auVar225._4_4_;
    auVar33._4_4_ = fVar390 * fVar296;
    auVar33._0_4_ = fVar384 * fVar234;
    fVar392 = auVar225._8_4_;
    auVar33._8_4_ = fVar392 * fVar265;
    fVar394 = auVar225._12_4_;
    auVar33._12_4_ = fVar394 * fVar237;
    fVar396 = auVar225._16_4_;
    auVar33._16_4_ = fVar396 * fVar272;
    fVar398 = auVar225._20_4_;
    auVar33._20_4_ = fVar398 * fVar301;
    fVar400 = auVar225._24_4_;
    auVar33._24_4_ = fVar400 * fVar351;
    auVar33._28_4_ = auVar12._28_4_;
    auVar34._4_4_ = fVar300 * fVar116;
    auVar34._0_4_ = fVar235 * fVar86;
    auVar34._8_4_ = fVar267 * fVar118;
    auVar34._12_4_ = fVar239 * fVar120;
    auVar34._16_4_ = fVar274 * fVar121;
    auVar34._20_4_ = fVar305 * fVar122;
    auVar34._24_4_ = fVar353 * fVar123;
    auVar34._28_4_ = fVar382;
    auVar12 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar300 * fVar304;
    auVar35._0_4_ = fVar235 * fVar236;
    auVar35._8_4_ = fVar267 * fVar269;
    auVar35._12_4_ = fVar239 * fVar241;
    auVar35._16_4_ = fVar274 * fVar276;
    auVar35._20_4_ = fVar305 * fVar309;
    auVar35._24_4_ = fVar353 * fVar407;
    auVar35._28_4_ = fVar382;
    auVar36._4_4_ = fVar390 * fVar292;
    auVar36._0_4_ = fVar384 * fVar233;
    auVar36._8_4_ = fVar392 * fVar240;
    auVar36._12_4_ = fVar394 * fVar275;
    auVar36._16_4_ = fVar396 * fVar270;
    auVar36._20_4_ = fVar398 * fVar297;
    fVar382 = auVar225._28_4_;
    auVar36._24_4_ = fVar400 * fVar349;
    auVar36._28_4_ = fVar382;
    auVar97 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ =
         fVar278 * (auVar16._4_4_ * auVar16._4_4_ +
                   auVar20._4_4_ * auVar20._4_4_ + auVar17._4_4_ * auVar17._4_4_);
    auVar37._0_4_ =
         fVar268 * (auVar16._0_4_ * auVar16._0_4_ +
                   auVar20._0_4_ * auVar20._0_4_ + auVar17._0_4_ * auVar17._0_4_);
    auVar37._8_4_ =
         fVar293 * (auVar16._8_4_ * auVar16._8_4_ +
                   auVar20._8_4_ * auVar20._8_4_ + auVar17._8_4_ * auVar17._8_4_);
    auVar37._12_4_ =
         fVar313 * (auVar16._12_4_ * auVar16._12_4_ +
                   auVar20._12_4_ * auVar20._12_4_ + auVar17._12_4_ * auVar17._12_4_);
    auVar37._16_4_ =
         fVar335 * (auVar16._16_4_ * auVar16._16_4_ +
                   auVar20._16_4_ * auVar20._16_4_ + auVar17._16_4_ * auVar17._16_4_);
    auVar37._20_4_ =
         fVar336 * (auVar16._20_4_ * auVar16._20_4_ +
                   auVar20._20_4_ * auVar20._20_4_ + auVar17._20_4_ * auVar17._20_4_);
    auVar37._24_4_ =
         fVar337 * (auVar16._24_4_ * auVar16._24_4_ +
                   auVar20._24_4_ * auVar20._24_4_ + auVar17._24_4_ * auVar17._24_4_);
    auVar37._28_4_ = auVar16._28_4_ + fVar232 + auVar17._28_4_;
    auVar38._4_4_ =
         (auVar96._4_4_ * auVar96._4_4_ +
         auVar12._4_4_ * auVar12._4_4_ + auVar97._4_4_ * auVar97._4_4_) * fVar278;
    auVar38._0_4_ =
         (auVar96._0_4_ * auVar96._0_4_ +
         auVar12._0_4_ * auVar12._0_4_ + auVar97._0_4_ * auVar97._0_4_) * fVar268;
    auVar38._8_4_ =
         (auVar96._8_4_ * auVar96._8_4_ +
         auVar12._8_4_ * auVar12._8_4_ + auVar97._8_4_ * auVar97._8_4_) * fVar293;
    auVar38._12_4_ =
         (auVar96._12_4_ * auVar96._12_4_ +
         auVar12._12_4_ * auVar12._12_4_ + auVar97._12_4_ * auVar97._12_4_) * fVar313;
    auVar38._16_4_ =
         (auVar96._16_4_ * auVar96._16_4_ +
         auVar12._16_4_ * auVar12._16_4_ + auVar97._16_4_ * auVar97._16_4_) * fVar335;
    auVar38._20_4_ =
         (auVar96._20_4_ * auVar96._20_4_ +
         auVar12._20_4_ * auVar12._20_4_ + auVar97._20_4_ * auVar97._20_4_) * fVar336;
    auVar38._24_4_ =
         (auVar96._24_4_ * auVar96._24_4_ +
         auVar12._24_4_ * auVar12._24_4_ + auVar97._24_4_ * auVar97._24_4_) * fVar337;
    auVar38._28_4_ = auVar95._28_4_ + auVar226._28_4_;
    auVar95 = vmaxps_avx(auVar37,auVar38);
    auVar12 = vperm2f128_avx(auVar287,auVar287,1);
    auVar12 = vshufps_avx(auVar12,auVar287,0x30);
    auVar16 = vshufps_avx(auVar287,auVar12,0x29);
    auVar172._0_4_ = auVar287._0_4_ + fVar238;
    auVar172._4_4_ = auVar287._4_4_ + fVar277;
    auVar172._8_4_ = auVar287._8_4_ + fVar308;
    auVar172._12_4_ = auVar287._12_4_ + fVar312;
    auVar172._16_4_ = auVar287._16_4_ + fVar271;
    auVar172._20_4_ = auVar287._20_4_ + fVar273;
    auVar172._24_4_ = auVar287._24_4_ + fVar266;
    auVar172._28_4_ = auVar287._28_4_ + auVar257._28_4_;
    auVar12 = vmaxps_avx(auVar287,auVar172);
    auVar225 = vmaxps_avx(auVar14,auVar16);
    auVar12 = vmaxps_avx(auVar12,auVar225);
    auVar225 = vrsqrtps_avx(auVar211);
    fVar232 = auVar225._0_4_;
    fVar238 = auVar225._4_4_;
    fVar277 = auVar225._8_4_;
    fVar308 = auVar225._12_4_;
    fVar312 = auVar225._16_4_;
    fVar271 = auVar225._20_4_;
    fVar273 = auVar225._24_4_;
    local_680 = fVar232 * 1.5 + fVar232 * fVar232 * fVar232 * auVar211._0_4_ * -0.5;
    fStack_67c = fVar238 * 1.5 + fVar238 * fVar238 * fVar238 * auVar211._4_4_ * -0.5;
    fStack_678 = fVar277 * 1.5 + fVar277 * fVar277 * fVar277 * auVar211._8_4_ * -0.5;
    fStack_674 = fVar308 * 1.5 + fVar308 * fVar308 * fVar308 * auVar211._12_4_ * -0.5;
    fStack_670 = fVar312 * 1.5 + fVar312 * fVar312 * fVar312 * auVar211._16_4_ * -0.5;
    fStack_66c = fVar271 * 1.5 + fVar271 * fVar271 * fVar271 * auVar211._20_4_ * -0.5;
    fStack_668 = fVar273 * 1.5 + fVar273 * fVar273 * fVar273 * auVar211._24_4_ * -0.5;
    fStack_664 = auVar225._28_4_ + auVar211._28_4_;
    auVar225 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_a80 = vsubps_avx(auVar225,auVar403);
    auVar225 = vsubps_avx(auVar225,local_2e0);
    fVar345 = auVar225._0_4_;
    fVar350 = auVar225._4_4_;
    fVar352 = auVar225._8_4_;
    fVar354 = auVar225._12_4_;
    fVar355 = auVar225._16_4_;
    fVar356 = auVar225._20_4_;
    fVar357 = auVar225._24_4_;
    fVar238 = local_a80._0_4_;
    fVar308 = local_a80._4_4_;
    fVar271 = local_a80._8_4_;
    fVar266 = local_a80._12_4_;
    fVar278 = local_a80._16_4_;
    fVar313 = local_a80._20_4_;
    fVar336 = local_a80._24_4_;
    auVar72._4_4_ = fVar294;
    auVar72._0_4_ = fVar279;
    auVar72._8_4_ = fVar298;
    auVar72._12_4_ = fVar302;
    auVar72._16_4_ = fVar306;
    auVar72._20_4_ = fVar310;
    auVar72._24_4_ = fVar314;
    auVar72._28_4_ = fVar316;
    auVar226 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar225 = vsubps_avx(auVar226,auVar72);
    fVar277 = auVar225._0_4_;
    fVar312 = auVar225._4_4_;
    fVar273 = auVar225._8_4_;
    fVar268 = auVar225._12_4_;
    fVar293 = auVar225._16_4_;
    fVar335 = auVar225._20_4_;
    fVar337 = auVar225._24_4_;
    auVar373._0_4_ =
         (float)local_880._0_4_ * fVar277 +
         (float)local_900._0_4_ * fVar238 + fVar345 * (float)local_8a0._0_4_;
    auVar373._4_4_ =
         (float)local_880._4_4_ * fVar312 +
         (float)local_900._4_4_ * fVar308 + fVar350 * (float)local_8a0._4_4_;
    auVar373._8_4_ = fStack_878 * fVar273 + fStack_8f8 * fVar271 + fVar352 * fStack_898;
    auVar373._12_4_ = fStack_874 * fVar268 + fStack_8f4 * fVar266 + fVar354 * fStack_894;
    auVar373._16_4_ = fStack_870 * fVar293 + fStack_8f0 * fVar278 + fVar355 * fStack_890;
    auVar373._20_4_ = fStack_86c * fVar335 + fStack_8ec * fVar313 + fVar356 * fStack_88c;
    auVar373._24_4_ = fStack_868 * fVar337 + fStack_8e8 * fVar336 + fVar357 * fStack_888;
    auVar373._28_4_ = fVar382 + auVar97._28_4_ + auVar211._28_4_;
    auVar388._0_4_ = fVar277 * fVar277 + fVar238 * fVar238 + fVar345 * fVar345;
    auVar388._4_4_ = fVar312 * fVar312 + fVar308 * fVar308 + fVar350 * fVar350;
    auVar388._8_4_ = fVar273 * fVar273 + fVar271 * fVar271 + fVar352 * fVar352;
    auVar388._12_4_ = fVar268 * fVar268 + fVar266 * fVar266 + fVar354 * fVar354;
    auVar388._16_4_ = fVar293 * fVar293 + fVar278 * fVar278 + fVar355 * fVar355;
    auVar388._20_4_ = fVar335 * fVar335 + fVar313 * fVar313 + fVar356 * fVar356;
    auVar388._24_4_ = fVar337 * fVar337 + fVar336 * fVar336 + fVar357 * fVar357;
    auVar388._28_4_ = local_2e0._28_4_ + local_2e0._28_4_ + fVar382;
    local_5e0 = (float)local_880._0_4_ * fVar235 * local_680 +
                local_680 * fVar233 * (float)local_900._0_4_ +
                fVar234 * local_680 * (float)local_8a0._0_4_;
    fStack_5dc = (float)local_880._4_4_ * fVar300 * fStack_67c +
                 fStack_67c * fVar292 * (float)local_900._4_4_ +
                 fVar296 * fStack_67c * (float)local_8a0._4_4_;
    fStack_5d8 = fStack_878 * fVar267 * fStack_678 +
                 fStack_678 * fVar240 * fStack_8f8 + fVar265 * fStack_678 * fStack_898;
    fStack_5d4 = fStack_874 * fVar239 * fStack_674 +
                 fStack_674 * fVar275 * fStack_8f4 + fVar237 * fStack_674 * fStack_894;
    fStack_5d0 = fStack_870 * fVar274 * fStack_670 +
                 fStack_670 * fVar270 * fStack_8f0 + fVar272 * fStack_670 * fStack_890;
    fStack_5cc = fStack_86c * fVar305 * fStack_66c +
                 fStack_66c * fVar297 * fStack_8ec + fVar301 * fStack_66c * fStack_88c;
    fStack_5c8 = fStack_868 * fVar353 * fStack_668 +
                 fStack_668 * fVar349 * fStack_8e8 + fVar351 * fStack_668 * fStack_888;
    fStack_5c4 = fStack_864 + fStack_8e4 + fStack_884;
    fVar232 = fStack_864 + fStack_8e4 + fStack_884;
    local_6a0._0_4_ =
         fVar277 * fVar235 * local_680 +
         local_680 * fVar233 * fVar238 + fVar345 * fVar234 * local_680;
    local_6a0._4_4_ =
         fVar312 * fVar300 * fStack_67c +
         fStack_67c * fVar292 * fVar308 + fVar350 * fVar296 * fStack_67c;
    local_6a0._8_4_ =
         fVar273 * fVar267 * fStack_678 +
         fStack_678 * fVar240 * fVar271 + fVar352 * fVar265 * fStack_678;
    local_6a0._12_4_ =
         fVar268 * fVar239 * fStack_674 +
         fStack_674 * fVar275 * fVar266 + fVar354 * fVar237 * fStack_674;
    local_6a0._16_4_ =
         fVar293 * fVar274 * fStack_670 +
         fStack_670 * fVar270 * fVar278 + fVar355 * fVar272 * fStack_670;
    local_6a0._20_4_ =
         fVar335 * fVar305 * fStack_66c +
         fStack_66c * fVar297 * fVar313 + fVar356 * fVar301 * fStack_66c;
    local_6a0._24_4_ =
         fVar337 * fVar353 * fStack_668 +
         fStack_668 * fVar349 * fVar336 + fVar357 * fVar351 * fStack_668;
    local_6a0._28_4_ = fStack_8e4 + fVar232;
    auVar39._4_4_ = fStack_5dc * local_6a0._4_4_;
    auVar39._0_4_ = local_5e0 * local_6a0._0_4_;
    auVar39._8_4_ = fStack_5d8 * local_6a0._8_4_;
    auVar39._12_4_ = fStack_5d4 * local_6a0._12_4_;
    auVar39._16_4_ = fStack_5d0 * local_6a0._16_4_;
    auVar39._20_4_ = fStack_5cc * local_6a0._20_4_;
    auVar39._24_4_ = fStack_5c8 * local_6a0._24_4_;
    auVar39._28_4_ = fVar232;
    auVar257 = vsubps_avx(auVar373,auVar39);
    auVar40._4_4_ = local_6a0._4_4_ * local_6a0._4_4_;
    auVar40._0_4_ = local_6a0._0_4_ * local_6a0._0_4_;
    auVar40._8_4_ = local_6a0._8_4_ * local_6a0._8_4_;
    auVar40._12_4_ = local_6a0._12_4_ * local_6a0._12_4_;
    auVar40._16_4_ = local_6a0._16_4_ * local_6a0._16_4_;
    auVar40._20_4_ = local_6a0._20_4_ * local_6a0._20_4_;
    auVar40._24_4_ = local_6a0._24_4_ * local_6a0._24_4_;
    auVar40._28_4_ = fStack_8e4;
    auVar17 = vsubps_avx(auVar388,auVar40);
    auVar225 = vsqrtps_avx(auVar95);
    fVar232 = (auVar225._0_4_ + auVar12._0_4_) * 1.0000002;
    fVar382 = (auVar225._4_4_ + auVar12._4_4_) * 1.0000002;
    fVar182 = (auVar225._8_4_ + auVar12._8_4_) * 1.0000002;
    fVar184 = (auVar225._12_4_ + auVar12._12_4_) * 1.0000002;
    fVar186 = (auVar225._16_4_ + auVar12._16_4_) * 1.0000002;
    fVar188 = (auVar225._20_4_ + auVar12._20_4_) * 1.0000002;
    fVar190 = (auVar225._24_4_ + auVar12._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar382 * fVar382;
    auVar41._0_4_ = fVar232 * fVar232;
    auVar41._8_4_ = fVar182 * fVar182;
    auVar41._12_4_ = fVar184 * fVar184;
    auVar41._16_4_ = fVar186 * fVar186;
    auVar41._20_4_ = fVar188 * fVar188;
    auVar41._24_4_ = fVar190 * fVar190;
    auVar41._28_4_ = auVar225._28_4_ + auVar12._28_4_;
    local_a00._0_4_ = auVar257._0_4_ + auVar257._0_4_;
    local_a00._4_4_ = auVar257._4_4_ + auVar257._4_4_;
    local_a00._8_4_ = auVar257._8_4_ + auVar257._8_4_;
    local_a00._12_4_ = auVar257._12_4_ + auVar257._12_4_;
    local_a00._16_4_ = auVar257._16_4_ + auVar257._16_4_;
    local_a00._20_4_ = auVar257._20_4_ + auVar257._20_4_;
    local_a00._24_4_ = auVar257._24_4_ + auVar257._24_4_;
    fVar232 = auVar257._28_4_;
    local_a00._28_4_ = fVar232 + fVar232;
    auVar12 = vsubps_avx(auVar17,auVar41);
    auVar42._4_4_ = fStack_5dc * fStack_5dc;
    auVar42._0_4_ = local_5e0 * local_5e0;
    auVar42._8_4_ = fStack_5d8 * fStack_5d8;
    auVar42._12_4_ = fStack_5d4 * fStack_5d4;
    auVar42._16_4_ = fStack_5d0 * fStack_5d0;
    auVar42._20_4_ = fStack_5cc * fStack_5cc;
    auVar42._24_4_ = fStack_5c8 * fStack_5c8;
    auVar42._28_4_ = fVar232;
    auVar257 = vsubps_avx(local_2c0,auVar42);
    auVar43._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    auVar43._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar43._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    auVar43._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    auVar43._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    auVar43._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    auVar43._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    auVar43._28_4_ = local_2c0._28_4_;
    fVar232 = auVar257._0_4_;
    fVar382 = auVar257._4_4_;
    fVar182 = auVar257._8_4_;
    fVar184 = auVar257._12_4_;
    fVar186 = auVar257._16_4_;
    fVar188 = auVar257._20_4_;
    fVar190 = auVar257._24_4_;
    auVar44._4_4_ = auVar12._4_4_ * fVar382 * 4.0;
    auVar44._0_4_ = auVar12._0_4_ * fVar232 * 4.0;
    auVar44._8_4_ = auVar12._8_4_ * fVar182 * 4.0;
    auVar44._12_4_ = auVar12._12_4_ * fVar184 * 4.0;
    auVar44._16_4_ = auVar12._16_4_ * fVar186 * 4.0;
    auVar44._20_4_ = auVar12._20_4_ * fVar188 * 4.0;
    auVar44._24_4_ = auVar12._24_4_ * fVar190 * 4.0;
    auVar44._28_4_ = 0x40800000;
    auVar20 = vsubps_avx(auVar43,auVar44);
    auVar95 = vcmpps_avx(auVar20,auVar226,5);
    auVar102._8_4_ = 0x7fffffff;
    auVar102._0_8_ = 0x7fffffff7fffffff;
    auVar102._12_4_ = 0x7fffffff;
    auVar102._16_4_ = 0x7fffffff;
    auVar102._20_4_ = 0x7fffffff;
    auVar102._24_4_ = 0x7fffffff;
    auVar102._28_4_ = 0x7fffffff;
    local_4c0 = vandps_avx(auVar42,auVar102);
    local_360._0_4_ = fVar232 + fVar232;
    local_360._4_4_ = fVar382 + fVar382;
    local_360._8_4_ = fVar182 + fVar182;
    local_360._12_4_ = fVar184 + fVar184;
    local_360._16_4_ = fVar186 + fVar186;
    local_360._20_4_ = fVar188 + fVar188;
    local_360._24_4_ = fVar190 + fVar190;
    local_360._28_4_ = auVar257._28_4_ + auVar257._28_4_;
    local_9e0 = vandps_avx(auVar257,auVar102);
    uVar77 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
    local_340._0_8_ = uVar77 ^ 0x8000000080000000;
    local_340._8_4_ = -local_a00._8_4_;
    local_340._12_4_ = -local_a00._12_4_;
    local_340._16_4_ = -local_a00._16_4_;
    local_340._20_4_ = -local_a00._20_4_;
    local_340._24_4_ = -local_a00._24_4_;
    local_340._28_4_ = -local_a00._28_4_;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      auVar404._8_4_ = 0x7f800000;
      auVar404._0_8_ = 0x7f8000007f800000;
      auVar404._12_4_ = 0x7f800000;
      auVar404._16_4_ = 0x7f800000;
      auVar404._20_4_ = 0x7f800000;
      auVar404._24_4_ = 0x7f800000;
      auVar404._28_4_ = 0x7f800000;
      auVar173._8_4_ = 0xff800000;
      auVar173._0_8_ = 0xff800000ff800000;
      auVar173._12_4_ = 0xff800000;
      auVar173._16_4_ = 0xff800000;
      auVar173._20_4_ = 0xff800000;
      auVar173._24_4_ = 0xff800000;
      auVar173._28_4_ = 0xff800000;
    }
    else {
      auVar97 = vsqrtps_avx(auVar20);
      auVar96 = vrcpps_avx(local_360);
      auVar257 = vcmpps_avx(auVar20,auVar226,5);
      fVar157 = auVar96._0_4_;
      fVar181 = auVar96._4_4_;
      auVar45._4_4_ = local_360._4_4_ * fVar181;
      auVar45._0_4_ = local_360._0_4_ * fVar157;
      fVar183 = auVar96._8_4_;
      auVar45._8_4_ = local_360._8_4_ * fVar183;
      fVar185 = auVar96._12_4_;
      auVar45._12_4_ = local_360._12_4_ * fVar185;
      fVar187 = auVar96._16_4_;
      auVar45._16_4_ = local_360._16_4_ * fVar187;
      fVar189 = auVar96._20_4_;
      auVar45._20_4_ = local_360._20_4_ * fVar189;
      fVar191 = auVar96._24_4_;
      auVar45._24_4_ = local_360._24_4_ * fVar191;
      auVar45._28_4_ = auVar20._28_4_;
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar103._16_4_ = 0x3f800000;
      auVar103._20_4_ = 0x3f800000;
      auVar103._24_4_ = 0x3f800000;
      auVar103._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar103,auVar45);
      fVar157 = fVar157 + fVar157 * auVar20._0_4_;
      fVar181 = fVar181 + fVar181 * auVar20._4_4_;
      fVar183 = fVar183 + fVar183 * auVar20._8_4_;
      fVar185 = fVar185 + fVar185 * auVar20._12_4_;
      fVar187 = fVar187 + fVar187 * auVar20._16_4_;
      fVar189 = fVar189 + fVar189 * auVar20._20_4_;
      fVar191 = fVar191 + fVar191 * auVar20._24_4_;
      auVar226 = vsubps_avx(local_340,auVar97);
      fVar280 = auVar226._0_4_ * fVar157;
      fVar295 = auVar226._4_4_ * fVar181;
      auVar46._4_4_ = fVar295;
      auVar46._0_4_ = fVar280;
      fVar299 = auVar226._8_4_ * fVar183;
      auVar46._8_4_ = fVar299;
      fVar303 = auVar226._12_4_ * fVar185;
      auVar46._12_4_ = fVar303;
      fVar307 = auVar226._16_4_ * fVar187;
      auVar46._16_4_ = fVar307;
      fVar311 = auVar226._20_4_ * fVar189;
      auVar46._20_4_ = fVar311;
      fVar315 = auVar226._24_4_ * fVar191;
      auVar46._24_4_ = fVar315;
      auVar46._28_4_ = auVar226._28_4_;
      auVar226 = vsubps_avx(auVar97,local_a00);
      fVar157 = auVar226._0_4_ * fVar157;
      fVar181 = auVar226._4_4_ * fVar181;
      auVar47._4_4_ = fVar181;
      auVar47._0_4_ = fVar157;
      fVar183 = auVar226._8_4_ * fVar183;
      auVar47._8_4_ = fVar183;
      fVar185 = auVar226._12_4_ * fVar185;
      auVar47._12_4_ = fVar185;
      fVar187 = auVar226._16_4_ * fVar187;
      auVar47._16_4_ = fVar187;
      fVar189 = auVar226._20_4_ * fVar189;
      auVar47._20_4_ = fVar189;
      fVar191 = auVar226._24_4_ * fVar191;
      auVar47._24_4_ = fVar191;
      auVar47._28_4_ = auVar96._28_4_ + auVar20._28_4_;
      fStack_484 = local_6a0._28_4_ + auVar226._28_4_;
      local_4a0 = local_680 * (local_6a0._0_4_ + local_5e0 * fVar280);
      fStack_49c = fStack_67c * (local_6a0._4_4_ + fStack_5dc * fVar295);
      fStack_498 = fStack_678 * (local_6a0._8_4_ + fStack_5d8 * fVar299);
      fStack_494 = fStack_674 * (local_6a0._12_4_ + fStack_5d4 * fVar303);
      fStack_490 = fStack_670 * (local_6a0._16_4_ + fStack_5d0 * fVar307);
      fStack_48c = fStack_66c * (local_6a0._20_4_ + fStack_5cc * fVar311);
      fStack_488 = fStack_668 * (local_6a0._24_4_ + fStack_5c8 * fVar315);
      local_480 = local_680 * (local_6a0._0_4_ + local_5e0 * fVar157);
      fStack_47c = fStack_67c * (local_6a0._4_4_ + fStack_5dc * fVar181);
      fStack_478 = fStack_678 * (local_6a0._8_4_ + fStack_5d8 * fVar183);
      fStack_474 = fStack_674 * (local_6a0._12_4_ + fStack_5d4 * fVar185);
      fStack_470 = fStack_670 * (local_6a0._16_4_ + fStack_5d0 * fVar187);
      fStack_46c = fStack_66c * (local_6a0._20_4_ + fStack_5cc * fVar189);
      fStack_468 = fStack_668 * (local_6a0._24_4_ + fStack_5c8 * fVar191);
      fStack_464 = local_6a0._28_4_ + fStack_484;
      auVar254._8_4_ = 0x7f800000;
      auVar254._0_8_ = 0x7f8000007f800000;
      auVar254._12_4_ = 0x7f800000;
      auVar254._16_4_ = 0x7f800000;
      auVar254._20_4_ = 0x7f800000;
      auVar254._24_4_ = 0x7f800000;
      auVar254._28_4_ = 0x7f800000;
      auVar404 = vblendvps_avx(auVar254,auVar46,auVar257);
      auVar255._8_4_ = 0xff800000;
      auVar255._0_8_ = 0xff800000ff800000;
      auVar255._12_4_ = 0xff800000;
      auVar255._16_4_ = 0xff800000;
      auVar255._20_4_ = 0xff800000;
      auVar255._24_4_ = 0xff800000;
      auVar255._28_4_ = 0xff800000;
      auVar173 = vblendvps_avx(auVar255,auVar47,auVar257);
      auVar20 = vmaxps_avx(local_620,local_4c0);
      auVar48._4_4_ = auVar20._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar20._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar20._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar20._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar20._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar20._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar20._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar20._28_4_;
      auVar20 = vcmpps_avx(local_9e0,auVar48,1);
      auVar226 = auVar257 & auVar20;
      if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar226 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar226 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar226 >> 0x7f,0) != '\0') ||
            (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar226 >> 0xbf,0) != '\0') ||
          (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar226[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar20,auVar257);
        auVar243 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar20 = vcmpps_avx(auVar12,_DAT_01f7b000,2);
        auVar343._8_4_ = 0xff800000;
        auVar343._0_8_ = 0xff800000ff800000;
        auVar343._12_4_ = 0xff800000;
        auVar343._16_4_ = 0xff800000;
        auVar343._20_4_ = 0xff800000;
        auVar343._24_4_ = 0xff800000;
        auVar343._28_4_ = 0xff800000;
        auVar375._8_4_ = 0x7f800000;
        auVar375._0_8_ = 0x7f8000007f800000;
        auVar375._12_4_ = 0x7f800000;
        auVar375._16_4_ = 0x7f800000;
        auVar375._20_4_ = 0x7f800000;
        auVar375._24_4_ = 0x7f800000;
        auVar375._28_4_ = 0x7f800000;
        auVar12 = vblendvps_avx(auVar375,auVar343,auVar20);
        auVar162 = vpmovsxwd_avx(auVar243);
        auVar243 = vpunpckhwd_avx(auVar243,auVar243);
        auVar290._16_16_ = auVar243;
        auVar290._0_16_ = auVar162;
        auVar404 = vblendvps_avx(auVar404,auVar12,auVar290);
        auVar12 = vblendvps_avx(auVar343,auVar375,auVar20);
        auVar173 = vblendvps_avx(auVar173,auVar12,auVar290);
        auVar263._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
        auVar263._8_4_ = auVar95._8_4_ ^ 0xffffffff;
        auVar263._12_4_ = auVar95._12_4_ ^ 0xffffffff;
        auVar263._16_4_ = auVar95._16_4_ ^ 0xffffffff;
        auVar263._20_4_ = auVar95._20_4_ ^ 0xffffffff;
        auVar263._24_4_ = auVar95._24_4_ ^ 0xffffffff;
        auVar263._28_4_ = auVar95._28_4_ ^ 0xffffffff;
        auVar95 = vorps_avx(auVar20,auVar263);
        auVar95 = vandps_avx(auVar257,auVar95);
      }
    }
    auVar12 = local_5a0 & auVar95;
    auVar291 = ZEXT3264(local_a40);
    fVar157 = (float)local_960._0_4_;
    fVar181 = (float)local_960._4_4_;
    fVar183 = fStack_958;
    fVar185 = fStack_954;
    fVar187 = fStack_950;
    fVar189 = fStack_94c;
    fVar191 = fStack_948;
    fVar280 = fStack_944;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar334 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar243 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_980._0_4_));
      auVar243 = vshufps_avx(auVar243,auVar243,0);
      auVar256._16_16_ = auVar243;
      auVar256._0_16_ = auVar243;
      auVar226 = vminps_avx(auVar256,auVar173);
      auVar104._0_4_ =
           (float)local_880._0_4_ * fVar371 +
           (float)local_900._0_4_ * fVar358 + (float)local_8a0._0_4_ * fVar383;
      auVar104._4_4_ =
           (float)local_880._4_4_ * fVar376 +
           (float)local_900._4_4_ * fVar365 + (float)local_8a0._4_4_ * fVar389;
      auVar104._8_4_ = fStack_878 * fVar377 + fStack_8f8 * fVar366 + fStack_898 * fVar391;
      auVar104._12_4_ = fStack_874 * fVar378 + fStack_8f4 * fVar367 + fStack_894 * fVar393;
      auVar104._16_4_ = fStack_870 * fVar379 + fStack_8f0 * fVar368 + fStack_890 * fVar395;
      auVar104._20_4_ = fStack_86c * fVar380 + fStack_8ec * fVar369 + fStack_88c * fVar397;
      auVar104._24_4_ = fStack_868 * fVar381 + fStack_8e8 * fVar370 + fStack_888 * fVar399;
      auVar104._28_4_ = fVar401 + auVar361._28_4_ + fVar401;
      auVar20 = vrcpps_avx(auVar104);
      fVar401 = auVar20._0_4_;
      fVar295 = auVar20._4_4_;
      auVar49._4_4_ = auVar104._4_4_ * fVar295;
      auVar49._0_4_ = auVar104._0_4_ * fVar401;
      fVar299 = auVar20._8_4_;
      auVar49._8_4_ = auVar104._8_4_ * fVar299;
      fVar303 = auVar20._12_4_;
      auVar49._12_4_ = auVar104._12_4_ * fVar303;
      fVar307 = auVar20._16_4_;
      auVar49._16_4_ = auVar104._16_4_ * fVar307;
      fVar311 = auVar20._20_4_;
      auVar49._20_4_ = auVar104._20_4_ * fVar311;
      fVar315 = auVar20._24_4_;
      auVar49._24_4_ = auVar104._24_4_ * fVar315;
      auVar49._28_4_ = fStack_8e4;
      auVar348._8_4_ = 0x3f800000;
      auVar348._0_8_ = 0x3f8000003f800000;
      auVar348._12_4_ = 0x3f800000;
      auVar348._16_4_ = 0x3f800000;
      auVar348._20_4_ = 0x3f800000;
      auVar348._24_4_ = 0x3f800000;
      auVar348._28_4_ = 0x3f800000;
      auVar96 = vsubps_avx(auVar348,auVar49);
      auVar288._8_4_ = 0x7fffffff;
      auVar288._0_8_ = 0x7fffffff7fffffff;
      auVar288._12_4_ = 0x7fffffff;
      auVar288._16_4_ = 0x7fffffff;
      auVar288._20_4_ = 0x7fffffff;
      auVar288._24_4_ = 0x7fffffff;
      auVar288._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar104,auVar288);
      auVar325._8_4_ = 0x219392ef;
      auVar325._0_8_ = 0x219392ef219392ef;
      auVar325._12_4_ = 0x219392ef;
      auVar325._16_4_ = 0x219392ef;
      auVar325._20_4_ = 0x219392ef;
      auVar325._24_4_ = 0x219392ef;
      auVar325._28_4_ = 0x219392ef;
      auVar257 = vcmpps_avx(auVar12,auVar325,1);
      auVar50._4_4_ =
           (fVar295 + fVar295 * auVar96._4_4_) *
           -(fVar312 * fVar376 + fVar365 * fVar308 + fVar350 * fVar389);
      auVar50._0_4_ =
           (fVar401 + fVar401 * auVar96._0_4_) *
           -(fVar277 * fVar371 + fVar358 * fVar238 + fVar345 * fVar383);
      auVar50._8_4_ =
           (fVar299 + fVar299 * auVar96._8_4_) *
           -(fVar273 * fVar377 + fVar366 * fVar271 + fVar352 * fVar391);
      auVar50._12_4_ =
           (fVar303 + fVar303 * auVar96._12_4_) *
           -(fVar268 * fVar378 + fVar367 * fVar266 + fVar354 * fVar393);
      auVar50._16_4_ =
           (fVar307 + fVar307 * auVar96._16_4_) *
           -(fVar293 * fVar379 + fVar368 * fVar278 + fVar355 * fVar395);
      auVar50._20_4_ =
           (fVar311 + fVar311 * auVar96._20_4_) *
           -(fVar335 * fVar380 + fVar369 * fVar313 + fVar356 * fVar397);
      auVar50._24_4_ =
           (fVar315 + fVar315 * auVar96._24_4_) *
           -(fVar337 * fVar381 + fVar370 * fVar336 + fVar357 * fVar399);
      auVar50._28_4_ = auVar20._28_4_ + auVar96._28_4_;
      auVar12 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,1);
      auVar12 = vorps_avx(auVar257,auVar12);
      auVar342._8_4_ = 0xff800000;
      auVar342._0_8_ = 0xff800000ff800000;
      auVar342._12_4_ = 0xff800000;
      auVar342._16_4_ = 0xff800000;
      auVar342._20_4_ = 0xff800000;
      auVar342._24_4_ = 0xff800000;
      auVar342._28_4_ = 0xff800000;
      auVar12 = vblendvps_avx(auVar50,auVar342,auVar12);
      auVar20 = vcmpps_avx(auVar104,ZEXT832(0) << 0x20,6);
      auVar257 = vorps_avx(auVar257,auVar20);
      auVar374._8_4_ = 0x7f800000;
      auVar374._0_8_ = 0x7f8000007f800000;
      auVar374._12_4_ = 0x7f800000;
      auVar374._16_4_ = 0x7f800000;
      auVar374._20_4_ = 0x7f800000;
      auVar374._24_4_ = 0x7f800000;
      auVar374._28_4_ = 0x7f800000;
      auVar257 = vblendvps_avx(auVar50,auVar374,auVar257);
      auVar20 = vmaxps_avx(local_440,auVar404);
      auVar20 = vmaxps_avx(auVar20,auVar12);
      auVar226 = vminps_avx(auVar226,auVar257);
      auVar257 = ZEXT832(0) << 0x20;
      auVar12 = vsubps_avx(auVar257,auVar13);
      auVar13 = vsubps_avx(auVar257,_local_b20);
      auVar51._4_4_ = auVar13._4_4_ * -fVar116;
      auVar51._0_4_ = auVar13._0_4_ * -fVar86;
      auVar51._8_4_ = auVar13._8_4_ * -fVar118;
      auVar51._12_4_ = auVar13._12_4_ * -fVar120;
      auVar51._16_4_ = auVar13._16_4_ * -fVar121;
      auVar51._20_4_ = auVar13._20_4_ * -fVar122;
      auVar51._24_4_ = auVar13._24_4_ * -fVar123;
      auVar51._28_4_ = auVar13._28_4_;
      auVar52._4_4_ = fVar304 * auVar12._4_4_;
      auVar52._0_4_ = fVar236 * auVar12._0_4_;
      auVar52._8_4_ = fVar269 * auVar12._8_4_;
      auVar52._12_4_ = fVar241 * auVar12._12_4_;
      auVar52._16_4_ = fVar276 * auVar12._16_4_;
      auVar52._20_4_ = fVar309 * auVar12._20_4_;
      auVar52._24_4_ = fVar407 * auVar12._24_4_;
      auVar52._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(auVar51,auVar52);
      auVar13 = vsubps_avx(auVar257,auVar15);
      auVar53._4_4_ = fVar390 * auVar13._4_4_;
      auVar53._0_4_ = fVar384 * auVar13._0_4_;
      auVar53._8_4_ = fVar392 * auVar13._8_4_;
      auVar53._12_4_ = fVar394 * auVar13._12_4_;
      auVar53._16_4_ = fVar396 * auVar13._16_4_;
      auVar53._20_4_ = fVar398 * auVar13._20_4_;
      uVar2 = auVar13._28_4_;
      auVar53._24_4_ = fVar400 * auVar13._24_4_;
      auVar53._28_4_ = uVar2;
      auVar257 = vsubps_avx(auVar12,auVar53);
      auVar54._4_4_ = (float)local_8a0._4_4_ * -fVar116;
      auVar54._0_4_ = (float)local_8a0._0_4_ * -fVar86;
      auVar54._8_4_ = fStack_898 * -fVar118;
      auVar54._12_4_ = fStack_894 * -fVar120;
      auVar54._16_4_ = fStack_890 * -fVar121;
      auVar54._20_4_ = fStack_88c * -fVar122;
      auVar54._24_4_ = fStack_888 * -fVar123;
      auVar54._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar362._8_4_ = 0x3f800000;
      auVar362._0_8_ = 0x3f8000003f800000;
      auVar362._12_4_ = 0x3f800000;
      auVar362._16_4_ = 0x3f800000;
      auVar362._20_4_ = 0x3f800000;
      auVar362._24_4_ = 0x3f800000;
      auVar362._28_4_ = 0x3f800000;
      auVar55._4_4_ = (float)local_900._4_4_ * fVar304;
      auVar55._0_4_ = (float)local_900._0_4_ * fVar236;
      auVar55._8_4_ = fStack_8f8 * fVar269;
      auVar55._12_4_ = fStack_8f4 * fVar241;
      auVar55._16_4_ = fStack_8f0 * fVar276;
      auVar55._20_4_ = fStack_8ec * fVar309;
      auVar55._24_4_ = fStack_8e8 * fVar407;
      auVar55._28_4_ = uVar2;
      auVar12 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_880._4_4_ * fVar390;
      auVar56._0_4_ = (float)local_880._0_4_ * fVar384;
      auVar56._8_4_ = fStack_878 * fVar392;
      auVar56._12_4_ = fStack_874 * fVar394;
      auVar56._16_4_ = fStack_870 * fVar396;
      auVar56._20_4_ = fStack_86c * fVar398;
      auVar56._24_4_ = fStack_868 * fVar400;
      auVar56._28_4_ = uVar2;
      auVar96 = vsubps_avx(auVar12,auVar56);
      auVar12 = vrcpps_avx(auVar96);
      fVar236 = auVar12._0_4_;
      auVar258._0_4_ = auVar96._0_4_ * fVar236;
      fVar238 = auVar12._4_4_;
      auVar258._4_4_ = auVar96._4_4_ * fVar238;
      fVar277 = auVar12._8_4_;
      auVar258._8_4_ = auVar96._8_4_ * fVar277;
      fVar304 = auVar12._12_4_;
      auVar258._12_4_ = auVar96._12_4_ * fVar304;
      fVar308 = auVar12._16_4_;
      auVar258._16_4_ = auVar96._16_4_ * fVar308;
      fVar312 = auVar12._20_4_;
      auVar258._20_4_ = auVar96._20_4_ * fVar312;
      fVar269 = auVar12._24_4_;
      auVar258._24_4_ = auVar96._24_4_ * fVar269;
      auVar258._28_4_ = 0;
      auVar97 = vsubps_avx(auVar362,auVar258);
      auVar105._8_4_ = 0x7fffffff;
      auVar105._0_8_ = 0x7fffffff7fffffff;
      auVar105._12_4_ = 0x7fffffff;
      auVar105._16_4_ = 0x7fffffff;
      auVar105._20_4_ = 0x7fffffff;
      auVar105._24_4_ = 0x7fffffff;
      auVar105._28_4_ = 0x7fffffff;
      auVar12 = vandps_avx(auVar96,auVar105);
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar106._16_4_ = 0x219392ef;
      auVar106._20_4_ = 0x219392ef;
      auVar106._24_4_ = 0x219392ef;
      auVar106._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar12,auVar106,1);
      auVar57._4_4_ = (fVar238 + fVar238 * auVar97._4_4_) * -auVar257._4_4_;
      auVar57._0_4_ = (fVar236 + fVar236 * auVar97._0_4_) * -auVar257._0_4_;
      auVar57._8_4_ = (fVar277 + fVar277 * auVar97._8_4_) * -auVar257._8_4_;
      auVar57._12_4_ = (fVar304 + fVar304 * auVar97._12_4_) * -auVar257._12_4_;
      auVar57._16_4_ = (fVar308 + fVar308 * auVar97._16_4_) * -auVar257._16_4_;
      auVar57._20_4_ = (fVar312 + fVar312 * auVar97._20_4_) * -auVar257._20_4_;
      auVar57._24_4_ = (fVar269 + fVar269 * auVar97._24_4_) * -auVar257._24_4_;
      auVar57._28_4_ = auVar257._28_4_ ^ 0x80000000;
      auVar12 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,1);
      auVar12 = vorps_avx(auVar13,auVar12);
      auVar12 = vblendvps_avx(auVar57,auVar342,auVar12);
      auVar257 = vmaxps_avx(auVar20,auVar12);
      auVar12 = vcmpps_avx(auVar96,ZEXT832(0) << 0x20,6);
      auVar12 = vorps_avx(auVar13,auVar12);
      auVar12 = vblendvps_avx(auVar57,auVar374,auVar12);
      auVar95 = vandps_avx(auVar95,local_5a0);
      local_4e0 = vminps_avx(auVar226,auVar12);
      auVar12 = vcmpps_avx(auVar257,local_4e0,2);
      auVar13 = auVar95 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar291 = ZEXT3264(local_a40);
      }
      else {
        auVar13 = vminps_avx(auVar287,auVar172);
        auVar14 = vminps_avx(auVar14,auVar16);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar13 = vsubps_avx(auVar13,auVar225);
        auVar95 = vandps_avx(auVar12,auVar95);
        auVar73._4_4_ = fStack_49c;
        auVar73._0_4_ = local_4a0;
        auVar73._8_4_ = fStack_498;
        auVar73._12_4_ = fStack_494;
        auVar73._16_4_ = fStack_490;
        auVar73._20_4_ = fStack_48c;
        auVar73._24_4_ = fStack_488;
        auVar73._28_4_ = fStack_484;
        auVar12 = vminps_avx(auVar73,auVar362);
        auVar221 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar85 + fVar124 * (auVar12._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar115 + fVar154 * (auVar12._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar117 + fVar155 * (auVar12._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar119 + fVar156 * (auVar12._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar85 + fVar124 * (auVar12._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar115 + fVar154 * (auVar12._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar117 + fVar155 * (auVar12._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar119 + auVar12._28_4_ + 7.0;
        auVar74._4_4_ = fStack_47c;
        auVar74._0_4_ = local_480;
        auVar74._8_4_ = fStack_478;
        auVar74._12_4_ = fStack_474;
        auVar74._16_4_ = fStack_470;
        auVar74._20_4_ = fStack_46c;
        auVar74._24_4_ = fStack_468;
        auVar74._28_4_ = fStack_464;
        auVar12 = vminps_avx(auVar74,auVar362);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar85 + fVar124 * (auVar12._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar115 + fVar154 * (auVar12._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar117 + fVar155 * (auVar12._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar119 + fVar156 * (auVar12._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar85 + fVar124 * (auVar12._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar115 + fVar154 * (auVar12._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar117 + fVar155 * (auVar12._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar119 + auVar12._28_4_ + 7.0;
        auVar58._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar58._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar58._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar58._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar58._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar58._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar58._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar58._28_4_ = 0x3f7ffffc;
        auVar12 = vmaxps_avx(ZEXT832(0) << 0x20,auVar58);
        auVar59._4_4_ = auVar12._4_4_ * auVar12._4_4_;
        auVar59._0_4_ = auVar12._0_4_ * auVar12._0_4_;
        auVar59._8_4_ = auVar12._8_4_ * auVar12._8_4_;
        auVar59._12_4_ = auVar12._12_4_ * auVar12._12_4_;
        auVar59._16_4_ = auVar12._16_4_ * auVar12._16_4_;
        auVar59._20_4_ = auVar12._20_4_ * auVar12._20_4_;
        auVar59._24_4_ = auVar12._24_4_ * auVar12._24_4_;
        auVar59._28_4_ = auVar12._28_4_;
        local_9a0 = vsubps_avx(auVar17,auVar59);
        auVar60._4_4_ = local_9a0._4_4_ * fVar382 * 4.0;
        auVar60._0_4_ = local_9a0._0_4_ * fVar232 * 4.0;
        auVar60._8_4_ = local_9a0._8_4_ * fVar182 * 4.0;
        auVar60._12_4_ = local_9a0._12_4_ * fVar184 * 4.0;
        auVar60._16_4_ = local_9a0._16_4_ * fVar186 * 4.0;
        auVar60._20_4_ = local_9a0._20_4_ * fVar188 * 4.0;
        auVar60._24_4_ = local_9a0._24_4_ * fVar190 * 4.0;
        auVar60._28_4_ = auVar12._28_4_;
        auVar13 = vsubps_avx(auVar43,auVar60);
        auVar12 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar12 >> 0x7f,0) == '\0') &&
              (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar12 >> 0xbf,0) == '\0') &&
            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar12[0x1f]) {
          auVar284 = ZEXT828(0) << 0x20;
          auVar250 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar338 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar386 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_b00 = ZEXT832(0) << 0x20;
          auVar326._8_4_ = 0x7f800000;
          auVar326._0_8_ = 0x7f8000007f800000;
          auVar326._12_4_ = 0x7f800000;
          auVar326._16_4_ = 0x7f800000;
          auVar326._20_4_ = 0x7f800000;
          auVar326._24_4_ = 0x7f800000;
          auVar326._28_4_ = 0x7f800000;
          auVar363._8_4_ = 0xff800000;
          auVar363._0_8_ = 0xff800000ff800000;
          auVar363._12_4_ = 0xff800000;
          auVar363._16_4_ = 0xff800000;
          auVar363._20_4_ = 0xff800000;
          auVar363._24_4_ = 0xff800000;
          auVar363._28_4_ = 0xff800000;
          local_9a0 = auVar15;
        }
        else {
          auVar14 = vrcpps_avx(local_360);
          fVar232 = auVar14._0_4_;
          auVar227._0_4_ = local_360._0_4_ * fVar232;
          fVar236 = auVar14._4_4_;
          auVar227._4_4_ = local_360._4_4_ * fVar236;
          fVar238 = auVar14._8_4_;
          auVar227._8_4_ = local_360._8_4_ * fVar238;
          fVar277 = auVar14._12_4_;
          auVar227._12_4_ = local_360._12_4_ * fVar277;
          fVar304 = auVar14._16_4_;
          auVar227._16_4_ = local_360._16_4_ * fVar304;
          fVar308 = auVar14._20_4_;
          auVar227._20_4_ = local_360._20_4_ * fVar308;
          fVar312 = auVar14._24_4_;
          auVar227._24_4_ = local_360._24_4_ * fVar312;
          auVar227._28_4_ = 0;
          auVar16 = vsubps_avx(auVar362,auVar227);
          auVar15 = vsqrtps_avx(auVar13);
          fVar232 = fVar232 + fVar232 * auVar16._0_4_;
          fVar236 = fVar236 + fVar236 * auVar16._4_4_;
          fVar238 = fVar238 + fVar238 * auVar16._8_4_;
          fVar277 = fVar277 + fVar277 * auVar16._12_4_;
          fVar304 = fVar304 + fVar304 * auVar16._16_4_;
          fVar308 = fVar308 + fVar308 * auVar16._20_4_;
          fVar312 = fVar312 + fVar312 * auVar16._24_4_;
          auVar17 = vsubps_avx(local_340,auVar15);
          fVar278 = auVar17._0_4_ * fVar232;
          fVar293 = auVar17._4_4_ * fVar236;
          auVar61._4_4_ = fVar293;
          auVar61._0_4_ = fVar278;
          fVar309 = auVar17._8_4_ * fVar238;
          auVar61._8_4_ = fVar309;
          fVar313 = auVar17._12_4_ * fVar277;
          auVar61._12_4_ = fVar313;
          fVar335 = auVar17._16_4_ * fVar304;
          auVar61._16_4_ = fVar335;
          fVar407 = auVar17._20_4_ * fVar308;
          auVar61._20_4_ = fVar407;
          fVar336 = auVar17._24_4_ * fVar312;
          auVar61._24_4_ = fVar336;
          auVar61._28_4_ = auVar95._28_4_;
          auVar17 = vsubps_avx(auVar15,local_a00);
          fVar232 = auVar17._0_4_ * fVar232;
          fVar236 = auVar17._4_4_ * fVar236;
          auVar62._4_4_ = fVar236;
          auVar62._0_4_ = fVar232;
          fVar238 = auVar17._8_4_ * fVar238;
          auVar62._8_4_ = fVar238;
          fVar277 = auVar17._12_4_ * fVar277;
          auVar62._12_4_ = fVar277;
          fVar304 = auVar17._16_4_ * fVar304;
          auVar62._16_4_ = fVar304;
          fVar308 = auVar17._20_4_ * fVar308;
          auVar62._20_4_ = fVar308;
          fVar312 = auVar17._24_4_ * fVar312;
          auVar62._24_4_ = fVar312;
          auVar62._28_4_ = fStack_8e4;
          fVar269 = (fVar278 * local_5e0 + local_6a0._0_4_) * local_680;
          fVar271 = (fVar293 * fStack_5dc + local_6a0._4_4_) * fStack_67c;
          fVar273 = (fVar309 * fStack_5d8 + local_6a0._8_4_) * fStack_678;
          fVar241 = (fVar313 * fStack_5d4 + local_6a0._12_4_) * fStack_674;
          fVar266 = (fVar335 * fStack_5d0 + local_6a0._16_4_) * fStack_670;
          fVar268 = (fVar407 * fStack_5cc + local_6a0._20_4_) * fStack_66c;
          fVar276 = (fVar336 * fStack_5c8 + local_6a0._24_4_) * fStack_668;
          auVar174._0_4_ = fVar279 + fVar269 * fVar235;
          auVar174._4_4_ = fVar294 + fVar271 * fVar300;
          auVar174._8_4_ = fVar298 + fVar273 * fVar267;
          auVar174._12_4_ = fVar302 + fVar241 * fVar239;
          auVar174._16_4_ = fVar306 + fVar266 * fVar274;
          auVar174._20_4_ = fVar310 + fVar268 * fVar305;
          auVar174._24_4_ = fVar314 + fVar276 * fVar353;
          auVar174._28_4_ = fVar316 + auVar14._28_4_ + auVar16._28_4_ + local_6a0._28_4_;
          auVar63._4_4_ = fVar293 * (float)local_880._4_4_;
          auVar63._0_4_ = fVar278 * (float)local_880._0_4_;
          auVar63._8_4_ = fVar309 * fStack_878;
          auVar63._12_4_ = fVar313 * fStack_874;
          auVar63._16_4_ = fVar335 * fStack_870;
          auVar63._20_4_ = fVar407 * fStack_86c;
          auVar63._24_4_ = fVar336 * fStack_868;
          auVar63._28_4_ = auVar15._28_4_;
          auVar16 = vsubps_avx(auVar63,auVar174);
          auVar259._0_4_ = auVar403._0_4_ + fVar233 * fVar269;
          auVar259._4_4_ = auVar403._4_4_ + fVar292 * fVar271;
          auVar259._8_4_ = auVar403._8_4_ + fVar240 * fVar273;
          auVar259._12_4_ = auVar403._12_4_ + fVar275 * fVar241;
          auVar259._16_4_ = auVar403._16_4_ + fVar270 * fVar266;
          auVar259._20_4_ = auVar403._20_4_ + fVar297 * fVar268;
          auVar259._24_4_ = auVar403._24_4_ + fVar349 * fVar276;
          auVar259._28_4_ = auVar403._28_4_ + auVar15._28_4_;
          auVar64._4_4_ = fVar293 * (float)local_900._4_4_;
          auVar64._0_4_ = fVar278 * (float)local_900._0_4_;
          auVar64._8_4_ = fVar309 * fStack_8f8;
          auVar64._12_4_ = fVar313 * fStack_8f4;
          auVar64._16_4_ = fVar335 * fStack_8f0;
          auVar64._20_4_ = fVar407 * fStack_8ec;
          auVar64._24_4_ = fVar336 * fStack_8e8;
          auVar64._28_4_ = fStack_8e4;
          local_9c0 = vsubps_avx(auVar64,auVar259);
          auVar228._0_4_ = local_2e0._0_4_ + fVar234 * fVar269;
          auVar228._4_4_ = local_2e0._4_4_ + fVar296 * fVar271;
          auVar228._8_4_ = local_2e0._8_4_ + fVar265 * fVar273;
          auVar228._12_4_ = local_2e0._12_4_ + fVar237 * fVar241;
          auVar228._16_4_ = local_2e0._16_4_ + fVar272 * fVar266;
          auVar228._20_4_ = local_2e0._20_4_ + fVar301 * fVar268;
          auVar228._24_4_ = local_2e0._24_4_ + fVar351 * fVar276;
          auVar228._28_4_ = local_2e0._28_4_ + auVar17._28_4_;
          auVar65._4_4_ = (float)local_8a0._4_4_ * fVar293;
          auVar65._0_4_ = (float)local_8a0._0_4_ * fVar278;
          auVar65._8_4_ = fStack_898 * fVar309;
          auVar65._12_4_ = fStack_894 * fVar313;
          auVar65._16_4_ = fStack_890 * fVar335;
          auVar65._20_4_ = fStack_88c * fVar407;
          auVar65._24_4_ = fStack_888 * fVar336;
          auVar65._28_4_ = auVar259._28_4_;
          _local_b00 = vsubps_avx(auVar65,auVar228);
          fVar269 = (fVar232 * local_5e0 + local_6a0._0_4_) * local_680;
          fVar271 = (fVar236 * fStack_5dc + local_6a0._4_4_) * fStack_67c;
          fVar273 = (fVar238 * fStack_5d8 + local_6a0._8_4_) * fStack_678;
          fVar241 = (fVar277 * fStack_5d4 + local_6a0._12_4_) * fStack_674;
          fVar266 = (fVar304 * fStack_5d0 + local_6a0._16_4_) * fStack_670;
          fVar268 = (fVar308 * fStack_5cc + local_6a0._20_4_) * fStack_66c;
          fVar276 = (fVar312 * fStack_5c8 + local_6a0._24_4_) * fStack_668;
          auVar229._0_4_ = fVar279 + fVar269 * fVar235;
          auVar229._4_4_ = fVar294 + fVar271 * fVar300;
          auVar229._8_4_ = fVar298 + fVar273 * fVar267;
          auVar229._12_4_ = fVar302 + fVar241 * fVar239;
          auVar229._16_4_ = fVar306 + fVar266 * fVar274;
          auVar229._20_4_ = fVar310 + fVar268 * fVar305;
          auVar229._24_4_ = fVar314 + fVar276 * fVar353;
          auVar229._28_4_ = fVar316 + local_b00._28_4_ + local_6a0._28_4_;
          auVar66._4_4_ = fVar236 * (float)local_880._4_4_;
          auVar66._0_4_ = fVar232 * (float)local_880._0_4_;
          auVar66._8_4_ = fVar238 * fStack_878;
          auVar66._12_4_ = fVar277 * fStack_874;
          auVar66._16_4_ = fVar304 * fStack_870;
          auVar66._20_4_ = fVar308 * fStack_86c;
          auVar66._24_4_ = fVar312 * fStack_868;
          auVar66._28_4_ = fStack_8e4;
          auVar14 = vsubps_avx(auVar66,auVar229);
          auVar221 = auVar14._0_28_;
          auVar289._0_4_ = auVar403._0_4_ + fVar233 * fVar269;
          auVar289._4_4_ = auVar403._4_4_ + fVar292 * fVar271;
          auVar289._8_4_ = auVar403._8_4_ + fVar240 * fVar273;
          auVar289._12_4_ = auVar403._12_4_ + fVar275 * fVar241;
          auVar289._16_4_ = auVar403._16_4_ + fVar270 * fVar266;
          auVar289._20_4_ = auVar403._20_4_ + fVar297 * fVar268;
          auVar289._24_4_ = auVar403._24_4_ + fVar349 * fVar276;
          auVar289._28_4_ = auVar403._28_4_ + fStack_8e4;
          auVar67._4_4_ = fVar236 * (float)local_900._4_4_;
          auVar67._0_4_ = fVar232 * (float)local_900._0_4_;
          auVar67._8_4_ = fVar238 * fStack_8f8;
          auVar67._12_4_ = fVar277 * fStack_8f4;
          auVar67._16_4_ = fVar304 * fStack_8f0;
          auVar67._20_4_ = fVar308 * fStack_8ec;
          auVar67._24_4_ = fVar312 * fStack_8e8;
          auVar67._28_4_ = fStack_864;
          auVar14 = vsubps_avx(auVar67,auVar289);
          auVar284 = auVar14._0_28_;
          auVar260._0_4_ = local_2e0._0_4_ + fVar234 * fVar269;
          auVar260._4_4_ = local_2e0._4_4_ + fVar296 * fVar271;
          auVar260._8_4_ = local_2e0._8_4_ + fVar265 * fVar273;
          auVar260._12_4_ = local_2e0._12_4_ + fVar237 * fVar241;
          auVar260._16_4_ = local_2e0._16_4_ + fVar272 * fVar266;
          auVar260._20_4_ = local_2e0._20_4_ + fVar301 * fVar268;
          auVar260._24_4_ = local_2e0._24_4_ + fVar351 * fVar276;
          auVar260._28_4_ = local_2e0._28_4_ + auVar259._28_4_;
          auVar68._4_4_ = (float)local_8a0._4_4_ * fVar236;
          auVar68._0_4_ = (float)local_8a0._0_4_ * fVar232;
          auVar68._8_4_ = fStack_898 * fVar238;
          auVar68._12_4_ = fStack_894 * fVar277;
          auVar68._16_4_ = fStack_890 * fVar304;
          auVar68._20_4_ = fStack_88c * fVar308;
          auVar68._24_4_ = fStack_888 * fVar312;
          auVar68._28_4_ = fStack_864;
          auVar14 = vsubps_avx(auVar68,auVar260);
          auVar250 = auVar14._0_28_;
          auVar13 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
          auVar327._8_4_ = 0x7f800000;
          auVar327._0_8_ = 0x7f8000007f800000;
          auVar327._12_4_ = 0x7f800000;
          auVar327._16_4_ = 0x7f800000;
          auVar327._20_4_ = 0x7f800000;
          auVar327._24_4_ = 0x7f800000;
          auVar327._28_4_ = 0x7f800000;
          auVar326 = vblendvps_avx(auVar327,auVar61,auVar13);
          auVar14 = vmaxps_avx(local_620,local_4c0);
          auVar69._4_4_ = auVar14._4_4_ * 1.9073486e-06;
          auVar69._0_4_ = auVar14._0_4_ * 1.9073486e-06;
          auVar69._8_4_ = auVar14._8_4_ * 1.9073486e-06;
          auVar69._12_4_ = auVar14._12_4_ * 1.9073486e-06;
          auVar69._16_4_ = auVar14._16_4_ * 1.9073486e-06;
          auVar69._20_4_ = auVar14._20_4_ * 1.9073486e-06;
          auVar69._24_4_ = auVar14._24_4_ * 1.9073486e-06;
          auVar69._28_4_ = auVar14._28_4_;
          auVar14 = vcmpps_avx(local_9e0,auVar69,1);
          auVar364._8_4_ = 0xff800000;
          auVar364._0_8_ = 0xff800000ff800000;
          auVar364._12_4_ = 0xff800000;
          auVar364._16_4_ = 0xff800000;
          auVar364._20_4_ = 0xff800000;
          auVar364._24_4_ = 0xff800000;
          auVar364._28_4_ = 0xff800000;
          auVar363 = vblendvps_avx(auVar364,auVar62,auVar13);
          auVar15 = auVar13 & auVar14;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0x7f,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0xbf,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar15[0x1f] < '\0') {
            auVar12 = vandps_avx(auVar14,auVar13);
            auVar243 = vpackssdw_avx(auVar12._0_16_,auVar12._16_16_);
            auVar15 = vcmpps_avx(local_9a0,_DAT_01f7b000,2);
            auVar180._8_4_ = 0xff800000;
            auVar180._0_8_ = 0xff800000ff800000;
            auVar180._12_4_ = 0xff800000;
            auVar180._16_4_ = 0xff800000;
            auVar180._20_4_ = 0xff800000;
            auVar180._24_4_ = 0xff800000;
            auVar180._28_4_ = 0xff800000;
            auVar344._8_4_ = 0x7f800000;
            auVar344._0_8_ = 0x7f8000007f800000;
            auVar344._12_4_ = 0x7f800000;
            auVar344._16_4_ = 0x7f800000;
            auVar344._20_4_ = 0x7f800000;
            auVar344._24_4_ = 0x7f800000;
            auVar344._28_4_ = 0x7f800000;
            auVar14 = vblendvps_avx(auVar344,auVar180,auVar15);
            auVar162 = vpmovsxwd_avx(auVar243);
            auVar243 = vpunpckhwd_avx(auVar243,auVar243);
            auVar405._16_16_ = auVar243;
            auVar405._0_16_ = auVar162;
            auVar326 = vblendvps_avx(auVar326,auVar14,auVar405);
            auVar14 = vblendvps_avx(auVar180,auVar344,auVar15);
            auVar363 = vblendvps_avx(auVar363,auVar14,auVar405);
            auVar213._0_8_ = auVar12._0_8_ ^ 0xffffffffffffffff;
            auVar213._8_4_ = auVar12._8_4_ ^ 0xffffffff;
            auVar213._12_4_ = auVar12._12_4_ ^ 0xffffffff;
            auVar213._16_4_ = auVar12._16_4_ ^ 0xffffffff;
            auVar213._20_4_ = auVar12._20_4_ ^ 0xffffffff;
            auVar213._24_4_ = auVar12._24_4_ ^ 0xffffffff;
            auVar213._28_4_ = auVar12._28_4_ ^ 0xffffffff;
            auVar12 = vorps_avx(auVar15,auVar213);
            auVar12 = vandps_avx(auVar13,auVar12);
          }
          auVar338 = auVar16._0_28_;
          auVar386 = local_9c0._0_28_;
          _local_b20 = auVar95;
        }
        _local_540 = auVar257;
        local_520 = vminps_avx(local_4e0,auVar326);
        auVar14 = vmaxps_avx(auVar257,auVar363);
        _local_500 = auVar14;
        auVar13 = vcmpps_avx(auVar257,local_520,2);
        local_b40 = vandps_avx(auVar95,auVar13);
        auVar13 = vcmpps_avx(auVar14,local_4e0,2);
        local_940 = vandps_avx(auVar95,auVar13);
        auVar95 = vorps_avx(local_940,local_b40);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) {
          auVar291 = ZEXT3264(local_a40);
        }
        else {
          auVar144._0_8_ = auVar12._0_8_ ^ 0xffffffffffffffff;
          auVar144._8_4_ = auVar12._8_4_ ^ 0xffffffff;
          auVar144._12_4_ = auVar12._12_4_ ^ 0xffffffff;
          auVar144._16_4_ = auVar12._16_4_ ^ 0xffffffff;
          auVar144._20_4_ = auVar12._20_4_ ^ 0xffffffff;
          auVar144._24_4_ = auVar12._24_4_ ^ 0xffffffff;
          auVar144._28_4_ = (uint)auVar12._28_4_ ^ 0xffffffff;
          auVar107._0_4_ =
               (float)local_880._0_4_ * auVar221._0_4_ +
               (float)local_900._0_4_ * auVar284._0_4_ + (float)local_8a0._0_4_ * auVar250._0_4_;
          auVar107._4_4_ =
               (float)local_880._4_4_ * auVar221._4_4_ +
               (float)local_900._4_4_ * auVar284._4_4_ + (float)local_8a0._4_4_ * auVar250._4_4_;
          auVar107._8_4_ =
               fStack_878 * auVar221._8_4_ +
               fStack_8f8 * auVar284._8_4_ + fStack_898 * auVar250._8_4_;
          auVar107._12_4_ =
               fStack_874 * auVar221._12_4_ +
               fStack_8f4 * auVar284._12_4_ + fStack_894 * auVar250._12_4_;
          auVar107._16_4_ =
               fStack_870 * auVar221._16_4_ +
               fStack_8f0 * auVar284._16_4_ + fStack_890 * auVar250._16_4_;
          auVar107._20_4_ =
               fStack_86c * auVar221._20_4_ +
               fStack_8ec * auVar284._20_4_ + fStack_88c * auVar250._20_4_;
          auVar107._24_4_ =
               fStack_868 * auVar221._24_4_ +
               fStack_8e8 * auVar284._24_4_ + fStack_888 * auVar250._24_4_;
          auVar107._28_4_ = fStack_884 + local_940._28_4_ + auVar95._28_4_;
          auVar230._8_4_ = 0x7fffffff;
          auVar230._0_8_ = 0x7fffffff7fffffff;
          auVar230._12_4_ = 0x7fffffff;
          auVar230._16_4_ = 0x7fffffff;
          auVar230._20_4_ = 0x7fffffff;
          auVar230._24_4_ = 0x7fffffff;
          auVar230._28_4_ = 0x7fffffff;
          auVar95 = vandps_avx(auVar107,auVar230);
          auVar261._8_4_ = 0x3e99999a;
          auVar261._0_8_ = 0x3e99999a3e99999a;
          auVar261._12_4_ = 0x3e99999a;
          auVar261._16_4_ = 0x3e99999a;
          auVar261._20_4_ = 0x3e99999a;
          auVar261._24_4_ = 0x3e99999a;
          auVar261._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar261,1);
          local_820 = vorps_avx(auVar95,auVar144);
          auVar108._0_4_ =
               auVar338._0_4_ * (float)local_880._0_4_ +
               (float)local_900._0_4_ * auVar386._0_4_ +
               (float)local_8a0._0_4_ * (float)local_b00._0_4_;
          auVar108._4_4_ =
               auVar338._4_4_ * (float)local_880._4_4_ +
               (float)local_900._4_4_ * auVar386._4_4_ +
               (float)local_8a0._4_4_ * (float)local_b00._4_4_;
          auVar108._8_4_ =
               auVar338._8_4_ * fStack_878 + fStack_8f8 * auVar386._8_4_ + fStack_898 * fStack_af8;
          auVar108._12_4_ =
               auVar338._12_4_ * fStack_874 + fStack_8f4 * auVar386._12_4_ + fStack_894 * fStack_af4
          ;
          auVar108._16_4_ =
               auVar338._16_4_ * fStack_870 + fStack_8f0 * auVar386._16_4_ + fStack_890 * fStack_af0
          ;
          auVar108._20_4_ =
               auVar338._20_4_ * fStack_86c + fStack_8ec * auVar386._20_4_ + fStack_88c * fStack_aec
          ;
          auVar108._24_4_ =
               auVar338._24_4_ * fStack_868 + fStack_8e8 * auVar386._24_4_ + fStack_888 * fStack_ae8
          ;
          auVar108._28_4_ = local_820._28_4_ + auVar12._28_4_ + fStack_884;
          auVar95 = vandps_avx(auVar108,auVar230);
          auVar95 = vcmpps_avx(auVar95,auVar261,1);
          auVar95 = vorps_avx(auVar95,auVar144);
          auVar145._8_4_ = 3;
          auVar145._0_8_ = 0x300000003;
          auVar145._12_4_ = 3;
          auVar145._16_4_ = 3;
          auVar145._20_4_ = 3;
          auVar145._24_4_ = 3;
          auVar145._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar175,auVar145,auVar95);
          local_840 = ZEXT432(local_d04);
          local_860 = vpshufd_avx(ZEXT416(local_d04),0);
          auVar243 = vpcmpgtd_avx(auVar95._16_16_,local_860);
          auStack_850 = auVar225._16_16_;
          auVar162 = vpcmpgtd_avx(auVar95._0_16_,local_860);
          auVar146._16_16_ = auVar243;
          auVar146._0_16_ = auVar162;
          local_800 = vblendps_avx(ZEXT1632(auVar162),auVar146,0xf0);
          local_560 = vandnps_avx(local_800,local_b40);
          local_920._4_4_ = auVar257._4_4_ + (float)local_960._4_4_;
          local_920._0_4_ = auVar257._0_4_ + (float)local_960._0_4_;
          fStack_918 = auVar257._8_4_ + fStack_958;
          fStack_914 = auVar257._12_4_ + fStack_954;
          fStack_910 = auVar257._16_4_ + fStack_950;
          fStack_90c = auVar257._20_4_ + fStack_94c;
          fStack_908 = auVar257._24_4_ + fStack_948;
          fStack_904 = auVar257._28_4_ + fStack_944;
          auVar264 = ZEXT3264(local_b40);
          while( true ) {
            auVar95 = _local_500;
            if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_560 >> 0x7f,0) == '\0') &&
                  (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_560 >> 0xbf,0) == '\0') &&
                (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_560[0x1f]) break;
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar95 = vblendvps_avx(auVar147,auVar257,local_560);
            auVar12 = vshufps_avx(auVar95,auVar95,0xb1);
            auVar12 = vminps_avx(auVar95,auVar12);
            auVar225 = vshufpd_avx(auVar12,auVar12,5);
            auVar12 = vminps_avx(auVar12,auVar225);
            auVar225 = vperm2f128_avx(auVar12,auVar12,1);
            auVar12 = vminps_avx(auVar12,auVar225);
            auVar12 = vcmpps_avx(auVar95,auVar12,0);
            auVar225 = local_560 & auVar12;
            auVar95 = local_560;
            if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar225 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar225 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar225 >> 0x7f,0) != '\0') ||
                  (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar225 >> 0xbf,0) != '\0') ||
                (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar225[0x1f] < '\0') {
              auVar95 = vandps_avx(auVar12,local_560);
            }
            uVar80 = vmovmskps_avx(auVar95);
            uVar81 = 0;
            if (uVar80 != 0) {
              for (; (uVar80 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
            uVar77 = (ulong)uVar81;
            *(undefined4 *)(local_560 + uVar77 * 4) = 0;
            fVar232 = local_1a0[uVar77];
            uVar81 = *(uint *)(local_540 + uVar77 * 4);
            fVar233 = auVar127._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar233 = sqrtf((float)local_a20._0_4_);
              uVar77 = extraout_RAX;
            }
            auVar162 = vminps_avx(_local_b50,_local_b70);
            auVar243 = vmaxps_avx(_local_b50,_local_b70);
            auVar3 = vminps_avx(_local_b60,_local_b80);
            auVar90 = vminps_avx(auVar162,auVar3);
            auVar162 = vmaxps_avx(_local_b60,_local_b80);
            auVar3 = vmaxps_avx(auVar243,auVar162);
            auVar194._8_4_ = 0x7fffffff;
            auVar194._0_8_ = 0x7fffffff7fffffff;
            auVar194._12_4_ = 0x7fffffff;
            auVar243 = vandps_avx(auVar90,auVar194);
            auVar162 = vandps_avx(auVar3,auVar194);
            auVar243 = vmaxps_avx(auVar243,auVar162);
            auVar162 = vmovshdup_avx(auVar243);
            auVar162 = vmaxss_avx(auVar162,auVar243);
            auVar243 = vshufpd_avx(auVar243,auVar243,1);
            auVar243 = vmaxss_avx(auVar243,auVar162);
            local_b00._0_4_ = auVar243._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar233 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar3,auVar3,0xff);
            auVar243 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar232),0x10);
            for (uVar82 = 0; bVar75 = (byte)uVar77, uVar82 != 5; uVar82 = uVar82 + 1) {
              auVar162 = vmovshdup_avx(auVar243);
              fVar240 = auVar162._0_4_;
              fVar236 = 1.0 - fVar240;
              auVar162 = vshufps_avx(auVar243,auVar243,0x55);
              fVar232 = auVar162._0_4_;
              fVar233 = auVar162._4_4_;
              fVar234 = auVar162._8_4_;
              fVar235 = auVar162._12_4_;
              auVar162 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
              fVar238 = auVar162._0_4_;
              fVar277 = auVar162._4_4_;
              fVar292 = auVar162._8_4_;
              fVar296 = auVar162._12_4_;
              fVar300 = (float)local_b60._0_4_ * fVar232 + (float)local_b70._0_4_ * fVar238;
              fVar304 = (float)local_b60._4_4_ * fVar233 + (float)local_b70._4_4_ * fVar277;
              fVar308 = fStack_b58 * fVar234 + fStack_b68 * fVar292;
              fVar312 = fStack_b54 * fVar235 + fStack_b64 * fVar296;
              auVar244._0_4_ =
                   fVar238 * ((float)local_b70._0_4_ * fVar232 + fVar238 * (float)local_b50._0_4_) +
                   fVar232 * fVar300;
              auVar244._4_4_ =
                   fVar277 * ((float)local_b70._4_4_ * fVar233 + fVar277 * (float)local_b50._4_4_) +
                   fVar233 * fVar304;
              auVar244._8_4_ =
                   fVar292 * (fStack_b68 * fVar234 + fVar292 * fStack_b48) + fVar234 * fVar308;
              auVar244._12_4_ =
                   fVar296 * (fStack_b64 * fVar235 + fVar296 * fStack_b44) + fVar235 * fVar312;
              auVar195._0_4_ =
                   fVar238 * fVar300 +
                   fVar232 * (fVar232 * (float)local_b80._0_4_ + (float)local_b60._0_4_ * fVar238);
              auVar195._4_4_ =
                   fVar277 * fVar304 +
                   fVar233 * (fVar233 * (float)local_b80._4_4_ + (float)local_b60._4_4_ * fVar277);
              auVar195._8_4_ =
                   fVar292 * fVar308 + fVar234 * (fVar234 * fStack_b78 + fStack_b58 * fVar292);
              auVar195._12_4_ =
                   fVar296 * fVar312 + fVar235 * (fVar235 * fStack_b74 + fStack_b54 * fVar296);
              auVar162 = vshufps_avx(auVar243,auVar243,0);
              auVar128._0_4_ = auVar162._0_4_ * (float)local_a10._0_4_ + 0.0;
              auVar128._4_4_ = auVar162._4_4_ * (float)local_a10._4_4_ + 0.0;
              auVar128._8_4_ = auVar162._8_4_ * fStack_a08 + 0.0;
              auVar128._12_4_ = auVar162._12_4_ * fStack_a04 + 0.0;
              auVar89._0_4_ = fVar238 * auVar244._0_4_ + fVar232 * auVar195._0_4_;
              auVar89._4_4_ = fVar277 * auVar244._4_4_ + fVar233 * auVar195._4_4_;
              auVar89._8_4_ = fVar292 * auVar244._8_4_ + fVar234 * auVar195._8_4_;
              auVar89._12_4_ = fVar296 * auVar244._12_4_ + fVar235 * auVar195._12_4_;
              local_9c0._0_16_ = auVar89;
              auVar162 = vsubps_avx(auVar128,auVar89);
              _local_b20 = auVar162;
              auVar162 = vdpps_avx(auVar162,auVar162,0x7f);
              fVar232 = auVar162._0_4_;
              if (fVar232 < 0.0) {
                fVar233 = sqrtf(fVar232);
                uVar77 = extraout_RAX_00;
              }
              else {
                auVar3 = vsqrtss_avx(auVar162,auVar162);
                fVar233 = auVar3._0_4_;
              }
              auVar3 = vsubps_avx(auVar195,auVar244);
              auVar317._0_4_ = auVar3._0_4_ * 3.0;
              auVar317._4_4_ = auVar3._4_4_ * 3.0;
              auVar317._8_4_ = auVar3._8_4_ * 3.0;
              auVar317._12_4_ = auVar3._12_4_ * 3.0;
              auVar3 = vshufps_avx(ZEXT416((uint)(fVar240 * 6.0)),ZEXT416((uint)(fVar240 * 6.0)),0);
              auVar90 = ZEXT416((uint)((fVar236 - (fVar240 + fVar240)) * 6.0));
              auVar159 = vshufps_avx(auVar90,auVar90,0);
              auVar90 = ZEXT416((uint)((fVar240 - (fVar236 + fVar236)) * 6.0));
              auVar196 = vshufps_avx(auVar90,auVar90,0);
              auVar4 = vshufps_avx(ZEXT416((uint)(fVar236 * 6.0)),ZEXT416((uint)(fVar236 * 6.0)),0);
              auVar90 = vdpps_avx(auVar317,auVar317,0x7f);
              auVar129._0_4_ =
                   auVar4._0_4_ * (float)local_b50._0_4_ +
                   auVar196._0_4_ * (float)local_b70._0_4_ +
                   auVar3._0_4_ * (float)local_b80._0_4_ + auVar159._0_4_ * (float)local_b60._0_4_;
              auVar129._4_4_ =
                   auVar4._4_4_ * (float)local_b50._4_4_ +
                   auVar196._4_4_ * (float)local_b70._4_4_ +
                   auVar3._4_4_ * (float)local_b80._4_4_ + auVar159._4_4_ * (float)local_b60._4_4_;
              auVar129._8_4_ =
                   auVar4._8_4_ * fStack_b48 +
                   auVar196._8_4_ * fStack_b68 +
                   auVar3._8_4_ * fStack_b78 + auVar159._8_4_ * fStack_b58;
              auVar129._12_4_ =
                   auVar4._12_4_ * fStack_b44 +
                   auVar196._12_4_ * fStack_b64 +
                   auVar3._12_4_ * fStack_b74 + auVar159._12_4_ * fStack_b54;
              auVar3 = vblendps_avx(auVar90,_DAT_01f45a50,0xe);
              auVar159 = vrsqrtss_avx(auVar3,auVar3);
              fVar235 = auVar159._0_4_;
              fVar234 = auVar90._0_4_;
              auVar159 = vdpps_avx(auVar317,auVar129,0x7f);
              auVar196 = vshufps_avx(auVar90,auVar90,0);
              auVar130._0_4_ = auVar129._0_4_ * auVar196._0_4_;
              auVar130._4_4_ = auVar129._4_4_ * auVar196._4_4_;
              auVar130._8_4_ = auVar129._8_4_ * auVar196._8_4_;
              auVar130._12_4_ = auVar129._12_4_ * auVar196._12_4_;
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar217._0_4_ = auVar317._0_4_ * auVar159._0_4_;
              auVar217._4_4_ = auVar317._4_4_ * auVar159._4_4_;
              auVar217._8_4_ = auVar317._8_4_ * auVar159._8_4_;
              auVar217._12_4_ = auVar317._12_4_ * auVar159._12_4_;
              auVar4 = vsubps_avx(auVar130,auVar217);
              auVar159 = vrcpss_avx(auVar3,auVar3);
              auVar3 = vmaxss_avx(ZEXT416((uint)local_b00._0_4_),
                                  ZEXT416((uint)(auVar243._0_4_ * (float)local_9a0._0_4_)));
              auVar159 = ZEXT416((uint)(auVar159._0_4_ * (2.0 - fVar234 * auVar159._0_4_)));
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              uVar70 = CONCAT44(auVar317._4_4_,auVar317._0_4_);
              auVar245._0_8_ = uVar70 ^ 0x8000000080000000;
              auVar245._8_4_ = -auVar317._8_4_;
              auVar245._12_4_ = -auVar317._12_4_;
              auVar196 = ZEXT416((uint)(fVar235 * 1.5 + fVar234 * -0.5 * fVar235 * fVar235 * fVar235
                                       ));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar197._0_4_ = auVar196._0_4_ * auVar4._0_4_ * auVar159._0_4_;
              auVar197._4_4_ = auVar196._4_4_ * auVar4._4_4_ * auVar159._4_4_;
              auVar197._8_4_ = auVar196._8_4_ * auVar4._8_4_ * auVar159._8_4_;
              auVar197._12_4_ = auVar196._12_4_ * auVar4._12_4_ * auVar159._12_4_;
              auVar282._0_4_ = auVar317._0_4_ * auVar196._0_4_;
              auVar282._4_4_ = auVar317._4_4_ * auVar196._4_4_;
              auVar282._8_4_ = auVar317._8_4_ * auVar196._8_4_;
              auVar282._12_4_ = auVar317._12_4_ * auVar196._12_4_;
              if (fVar234 < 0.0) {
                local_a60._0_16_ = auVar282;
                local_a80._0_16_ = auVar197;
                fVar234 = sqrtf(fVar234);
                uVar77 = extraout_RAX_01;
                auVar197 = local_a80._0_16_;
                auVar282 = local_a60._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar90,auVar90);
                fVar234 = auVar90._0_4_;
              }
              auVar90 = vdpps_avx(_local_b20,auVar282,0x7f);
              fVar233 = ((float)local_b00._0_4_ / fVar234) * (fVar233 + 1.0) +
                        auVar3._0_4_ + fVar233 * (float)local_b00._0_4_;
              auVar159 = vdpps_avx(auVar245,auVar282,0x7f);
              auVar196 = vdpps_avx(_local_b20,auVar197,0x7f);
              auVar4 = vdpps_avx(_local_a10,auVar282,0x7f);
              auVar5 = vdpps_avx(_local_b20,auVar245,0x7f);
              fVar234 = auVar159._0_4_ + auVar196._0_4_;
              fVar235 = auVar90._0_4_;
              auVar91._0_4_ = fVar235 * fVar235;
              auVar91._4_4_ = auVar90._4_4_ * auVar90._4_4_;
              auVar91._8_4_ = auVar90._8_4_ * auVar90._8_4_;
              auVar91._12_4_ = auVar90._12_4_ * auVar90._12_4_;
              auVar196 = vsubps_avx(auVar162,auVar91);
              auVar159 = vdpps_avx(_local_b20,_local_a10,0x7f);
              fVar236 = auVar5._0_4_ - fVar235 * fVar234;
              fVar238 = auVar159._0_4_ - fVar235 * auVar4._0_4_;
              auVar159 = vrsqrtss_avx(auVar196,auVar196);
              fVar277 = auVar196._0_4_;
              fVar235 = auVar159._0_4_;
              fVar235 = fVar235 * 1.5 + fVar277 * -0.5 * fVar235 * fVar235 * fVar235;
              if (fVar277 < 0.0) {
                local_a60._0_16_ = auVar4;
                local_a80._0_16_ = ZEXT416((uint)fVar234);
                local_9e0._0_4_ = fVar236;
                local_a00._0_4_ = fVar238;
                local_8c0._0_4_ = fVar235;
                fVar277 = sqrtf(fVar277);
                uVar77 = extraout_RAX_02;
                fVar235 = (float)local_8c0._0_4_;
                fVar236 = (float)local_9e0._0_4_;
                fVar238 = (float)local_a00._0_4_;
                auVar4 = local_a60._0_16_;
                auVar159 = local_a80._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar196,auVar196);
                fVar277 = auVar159._0_4_;
                auVar159 = ZEXT416((uint)fVar234);
              }
              auVar5 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar6 = vshufps_avx(auVar317,auVar317,0xff);
              fVar234 = fVar236 * fVar235 - auVar6._0_4_;
              auVar218._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
              auVar218._8_4_ = auVar4._8_4_ ^ 0x80000000;
              auVar218._12_4_ = auVar4._12_4_ ^ 0x80000000;
              auVar246._0_4_ = -fVar234;
              auVar246._4_4_ = 0x80000000;
              auVar246._8_4_ = 0x80000000;
              auVar246._12_4_ = 0x80000000;
              auVar196 = vinsertps_avx(auVar246,ZEXT416((uint)(fVar238 * fVar235)),0x1c);
              auVar4 = vmovsldup_avx(ZEXT416((uint)(auVar159._0_4_ * fVar238 * fVar235 -
                                                   auVar4._0_4_ * fVar234)));
              auVar196 = vdivps_avx(auVar196,auVar4);
              auVar159 = vinsertps_avx(auVar159,auVar218,0x10);
              auVar159 = vdivps_avx(auVar159,auVar4);
              auVar4 = vmovsldup_avx(auVar90);
              auVar92 = ZEXT416((uint)(fVar277 - auVar5._0_4_));
              auVar5 = vmovsldup_avx(auVar92);
              auVar160._0_4_ = auVar4._0_4_ * auVar196._0_4_ + auVar5._0_4_ * auVar159._0_4_;
              auVar160._4_4_ = auVar4._4_4_ * auVar196._4_4_ + auVar5._4_4_ * auVar159._4_4_;
              auVar160._8_4_ = auVar4._8_4_ * auVar196._8_4_ + auVar5._8_4_ * auVar159._8_4_;
              auVar160._12_4_ = auVar4._12_4_ * auVar196._12_4_ + auVar5._12_4_ * auVar159._12_4_;
              auVar243 = vsubps_avx(auVar243,auVar160);
              auVar161._8_4_ = 0x7fffffff;
              auVar161._0_8_ = 0x7fffffff7fffffff;
              auVar161._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx(auVar90,auVar161);
              if (auVar90._0_4_ < fVar233) {
                auVar198._8_4_ = 0x7fffffff;
                auVar198._0_8_ = 0x7fffffff7fffffff;
                auVar198._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar92,auVar198);
                if (auVar90._0_4_ < (float)local_8e0._0_4_ * 1.9073486e-06 + auVar3._0_4_ + fVar233)
                {
                  bVar84 = uVar82 < 5;
                  fVar233 = auVar243._0_4_ + (float)local_980._0_4_;
                  if (fVar233 < fVar214) {
                    bVar75 = 0;
                    goto LAB_009df1a3;
                  }
                  fVar234 = *(float *)(ray + k * 4 + 0x100);
                  auVar264 = ZEXT3264(local_b40);
                  if (fVar233 <= fVar234) {
                    auVar3 = vmovshdup_avx(auVar243);
                    bVar75 = 0;
                    if ((auVar3._0_4_ < 0.0) || (bVar75 = 0, 1.0 < auVar3._0_4_)) goto LAB_009df1b5;
                    auVar162 = vrsqrtss_avx(auVar162,auVar162);
                    fVar235 = auVar162._0_4_;
                    pGVar8 = (context->scene->geometries).items[local_ab8].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar75 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_009df1b5;
                      auVar162 = ZEXT416((uint)(fVar235 * 1.5 +
                                               fVar232 * -0.5 * fVar235 * fVar235 * fVar235));
                      auVar162 = vshufps_avx(auVar162,auVar162,0);
                      auVar163._0_4_ = auVar162._0_4_ * (float)local_b20._0_4_;
                      auVar163._4_4_ = auVar162._4_4_ * (float)local_b20._4_4_;
                      auVar163._8_4_ = auVar162._8_4_ * fStack_b18;
                      auVar163._12_4_ = auVar162._12_4_ * fStack_b14;
                      auVar131._0_4_ = auVar317._0_4_ + auVar6._0_4_ * auVar163._0_4_;
                      auVar131._4_4_ = auVar317._4_4_ + auVar6._4_4_ * auVar163._4_4_;
                      auVar131._8_4_ = auVar317._8_4_ + auVar6._8_4_ * auVar163._8_4_;
                      auVar131._12_4_ = auVar317._12_4_ + auVar6._12_4_ * auVar163._12_4_;
                      auVar162 = vshufps_avx(auVar163,auVar163,0xc9);
                      auVar3 = vshufps_avx(auVar317,auVar317,0xc9);
                      auVar164._0_4_ = auVar3._0_4_ * auVar163._0_4_;
                      auVar164._4_4_ = auVar3._4_4_ * auVar163._4_4_;
                      auVar164._8_4_ = auVar3._8_4_ * auVar163._8_4_;
                      auVar164._12_4_ = auVar3._12_4_ * auVar163._12_4_;
                      auVar199._0_4_ = auVar317._0_4_ * auVar162._0_4_;
                      auVar199._4_4_ = auVar317._4_4_ * auVar162._4_4_;
                      auVar199._8_4_ = auVar317._8_4_ * auVar162._8_4_;
                      auVar199._12_4_ = auVar317._12_4_ * auVar162._12_4_;
                      auVar90 = vsubps_avx(auVar199,auVar164);
                      auVar162 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar3 = vshufps_avx(auVar131,auVar131,0xc9);
                      auVar200._0_4_ = auVar3._0_4_ * auVar162._0_4_;
                      auVar200._4_4_ = auVar3._4_4_ * auVar162._4_4_;
                      auVar200._8_4_ = auVar3._8_4_ * auVar162._8_4_;
                      auVar200._12_4_ = auVar3._12_4_ * auVar162._12_4_;
                      auVar162 = vshufps_avx(auVar90,auVar90,0xd2);
                      auVar132._0_4_ = auVar131._0_4_ * auVar162._0_4_;
                      auVar132._4_4_ = auVar131._4_4_ * auVar162._4_4_;
                      auVar132._8_4_ = auVar131._8_4_ * auVar162._8_4_;
                      auVar132._12_4_ = auVar131._12_4_ * auVar162._12_4_;
                      auVar162 = vsubps_avx(auVar200,auVar132);
                      pRVar10 = context->user;
                      local_760 = vshufps_avx(auVar243,auVar243,0x55);
                      auStack_7b0 = vshufps_avx(auVar162,auVar162,0x55);
                      local_7a0 = vshufps_avx(auVar162,auVar162,0xaa);
                      local_780 = vshufps_avx(auVar162,auVar162,0);
                      local_7c0 = (RTCHitN  [16])auStack_7b0;
                      local_740 = ZEXT832(0) << 0x20;
                      local_720 = local_660._0_8_;
                      uStack_718 = local_660._8_8_;
                      uStack_710 = local_660._16_8_;
                      uStack_708 = local_660._24_8_;
                      local_700 = local_640;
                      auVar95 = vcmpps_avx(local_640,local_640,0xf);
                      local_ac0[1] = auVar95;
                      *local_ac0 = auVar95;
                      local_6e0 = pRVar10->instID[0];
                      local_6c0 = pRVar10->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar233;
                      local_ba0 = *local_ac8;
                      local_b90 = *local_ad0;
                      local_ab0.valid = (int *)local_ba0;
                      local_ab0.geometryUserPtr = pGVar8->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_7c0;
                      local_ab0.N = 8;
                      local_ab0.ray = (RTCRayN *)ray;
                      local_790 = local_7a0;
                      local_770 = local_780;
                      local_750 = local_760;
                      uStack_6dc = local_6e0;
                      uStack_6d8 = local_6e0;
                      uStack_6d4 = local_6e0;
                      uStack_6d0 = local_6e0;
                      uStack_6cc = local_6e0;
                      uStack_6c8 = local_6e0;
                      uStack_6c4 = local_6e0;
                      uStack_6bc = local_6c0;
                      uStack_6b8 = local_6c0;
                      uStack_6b4 = local_6c0;
                      uStack_6b0 = local_6c0;
                      uStack_6ac = local_6c0;
                      uStack_6a8 = local_6c0;
                      uStack_6a4 = local_6c0;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_ab0);
                      }
                      auVar243 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar162 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar176._16_16_ = auVar162;
                      auVar176._0_16_ = auVar243;
                      auVar95 = _DAT_01f7b020 & ~auVar176;
                      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar95 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar95 >> 0x7f,0) == '\0') &&
                            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar95 >> 0xbf,0) == '\0') &&
                          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar95[0x1f]) {
                        auVar264 = ZEXT3264(local_b40);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_ab0);
                        }
                        auVar243 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar162 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar109._16_16_ = auVar162;
                        auVar109._0_16_ = auVar243;
                        auVar148._8_4_ = 0xff800000;
                        auVar148._0_8_ = 0xff800000ff800000;
                        auVar148._12_4_ = 0xff800000;
                        auVar148._16_4_ = 0xff800000;
                        auVar148._20_4_ = 0xff800000;
                        auVar148._24_4_ = 0xff800000;
                        auVar148._28_4_ = 0xff800000;
                        auVar95 = vblendvps_avx(auVar148,*(undefined1 (*) [32])
                                                          (local_ab0.ray + 0x100),auVar109);
                        *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar95;
                        auVar95 = _DAT_01f7b020 & ~auVar109;
                        auVar264 = ZEXT3264(local_b40);
                        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar95 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar95 >> 0xbf,0) != '\0') ||
                            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar95[0x1f] < '\0') {
                          bVar75 = 1;
                          goto LAB_009df1b5;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar234;
                      bVar75 = 0;
                      goto LAB_009df1b5;
                    }
                  }
                  bVar75 = 0;
                  goto LAB_009df1b5;
                }
              }
            }
            bVar84 = false;
LAB_009df1a3:
            auVar264 = ZEXT3264(local_b40);
LAB_009df1b5:
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar332._4_4_ = uVar2;
            auVar332._0_4_ = uVar2;
            auVar332._8_4_ = uVar2;
            auVar332._12_4_ = uVar2;
            auVar332._16_4_ = uVar2;
            auVar332._20_4_ = uVar2;
            auVar332._24_4_ = uVar2;
            auVar332._28_4_ = uVar2;
            auVar334 = ZEXT3264(auVar332);
            bVar83 = bVar83 | bVar84 & bVar75;
            auVar95 = vcmpps_avx(_local_920,auVar332,2);
            local_560 = vandps_avx(auVar95,local_560);
          }
          auVar110._0_4_ = auVar14._0_4_ + (float)local_960._0_4_;
          auVar110._4_4_ = auVar14._4_4_ + (float)local_960._4_4_;
          auVar110._8_4_ = auVar14._8_4_ + fStack_958;
          auVar110._12_4_ = auVar14._12_4_ + fStack_954;
          auVar110._16_4_ = auVar14._16_4_ + fStack_950;
          auVar110._20_4_ = auVar14._20_4_ + fStack_94c;
          auVar110._24_4_ = auVar14._24_4_ + fStack_948;
          auVar110._28_4_ = auVar14._28_4_ + fStack_944;
          auVar243 = vshufps_avx(auVar334._0_16_,auVar334._0_16_,0);
          auVar149._16_16_ = auVar243;
          auVar149._0_16_ = auVar243;
          auVar12 = vcmpps_avx(auVar110,auVar149,2);
          _local_920 = vandps_avx(auVar12,local_940);
          auVar111._8_4_ = 3;
          auVar111._0_8_ = 0x300000003;
          auVar111._12_4_ = 3;
          auVar111._16_4_ = 3;
          auVar111._20_4_ = 3;
          auVar111._24_4_ = 3;
          auVar111._28_4_ = 3;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar12 = vblendvps_avx(auVar150,auVar111,local_820);
          auVar243 = vpcmpgtd_avx(auVar12._16_16_,local_860);
          auVar162 = vpshufd_avx(local_840._0_16_,0);
          auVar162 = vpcmpgtd_avx(auVar12._0_16_,auVar162);
          auVar151._16_16_ = auVar243;
          auVar151._0_16_ = auVar162;
          local_940 = vblendps_avx(ZEXT1632(auVar162),auVar151,0xf0);
          local_580 = vandnps_avx(local_940,_local_920);
          local_c20._4_4_ = (float)local_960._4_4_ + (float)local_500._4_4_;
          local_c20._0_4_ = (float)local_960._0_4_ + (float)local_500._0_4_;
          fStack_c18 = fStack_958 + fStack_4f8;
          fStack_c14 = fStack_954 + fStack_4f4;
          fStack_c10 = fStack_950 + fStack_4f0;
          fStack_c0c = fStack_94c + fStack_4ec;
          fStack_c08 = fStack_948 + fStack_4e8;
          fStack_c04 = fStack_944 + fStack_4e4;
          auVar291 = ZEXT3264(local_a40);
          for (; (((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_580 >> 0x7f,0) != '\0') ||
                   (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_580 >> 0xbf,0) != '\0') ||
                 (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_580[0x1f] < '\0'; local_580 = vandps_avx(auVar12,local_580)) {
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar152,auVar95,local_580);
            auVar225 = vshufps_avx(auVar12,auVar12,0xb1);
            auVar225 = vminps_avx(auVar12,auVar225);
            auVar13 = vshufpd_avx(auVar225,auVar225,5);
            auVar225 = vminps_avx(auVar225,auVar13);
            auVar13 = vperm2f128_avx(auVar225,auVar225,1);
            auVar225 = vminps_avx(auVar225,auVar13);
            auVar225 = vcmpps_avx(auVar12,auVar225,0);
            auVar13 = local_580 & auVar225;
            auVar12 = local_580;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0x7f,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar13[0x1f] < '\0') {
              auVar12 = vandps_avx(auVar225,local_580);
            }
            uVar80 = vmovmskps_avx(auVar12);
            uVar81 = 0;
            if (uVar80 != 0) {
              for (; (uVar80 >> uVar81 & 1) == 0; uVar81 = uVar81 + 1) {
              }
            }
            uVar77 = (ulong)uVar81;
            *(undefined4 *)(local_580 + uVar77 * 4) = 0;
            fVar232 = local_1c0[uVar77];
            uVar81 = *(uint *)(local_4e0 + uVar77 * 4);
            fVar233 = auVar19._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar233 = sqrtf((float)local_a20._0_4_);
              auVar291 = ZEXT3264(local_a40);
              uVar77 = extraout_RAX_03;
            }
            auVar162 = vminps_avx(_local_b50,_local_b70);
            auVar243 = vmaxps_avx(_local_b50,_local_b70);
            auVar3 = vminps_avx(_local_b60,_local_b80);
            auVar90 = vminps_avx(auVar162,auVar3);
            auVar162 = vmaxps_avx(_local_b60,_local_b80);
            auVar3 = vmaxps_avx(auVar243,auVar162);
            auVar201._8_4_ = 0x7fffffff;
            auVar201._0_8_ = 0x7fffffff7fffffff;
            auVar201._12_4_ = 0x7fffffff;
            auVar243 = vandps_avx(auVar90,auVar201);
            auVar162 = vandps_avx(auVar3,auVar201);
            auVar243 = vmaxps_avx(auVar243,auVar162);
            auVar162 = vmovshdup_avx(auVar243);
            auVar162 = vmaxss_avx(auVar162,auVar243);
            auVar243 = vshufpd_avx(auVar243,auVar243,1);
            auVar243 = vmaxss_avx(auVar243,auVar162);
            local_b00._0_4_ = auVar243._0_4_ * 1.9073486e-06;
            local_9a0._0_4_ = fVar233 * 1.9073486e-06;
            local_8e0._0_16_ = vshufps_avx(auVar3,auVar3,0xff);
            auVar243 = vinsertps_avx(ZEXT416(uVar81),ZEXT416((uint)fVar232),0x10);
            for (uVar82 = 0; bVar75 = (byte)uVar77, uVar82 != 5; uVar82 = uVar82 + 1) {
              auVar162 = vmovshdup_avx(auVar243);
              fVar240 = auVar162._0_4_;
              fVar236 = 1.0 - fVar240;
              auVar162 = vshufps_avx(auVar243,auVar243,0x55);
              fVar232 = auVar162._0_4_;
              fVar233 = auVar162._4_4_;
              fVar234 = auVar162._8_4_;
              fVar235 = auVar162._12_4_;
              auVar162 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
              fVar238 = auVar162._0_4_;
              fVar277 = auVar162._4_4_;
              fVar292 = auVar162._8_4_;
              fVar296 = auVar162._12_4_;
              fVar300 = (float)local_b60._0_4_ * fVar232 + (float)local_b70._0_4_ * fVar238;
              fVar304 = (float)local_b60._4_4_ * fVar233 + (float)local_b70._4_4_ * fVar277;
              fVar308 = fStack_b58 * fVar234 + fStack_b68 * fVar292;
              fVar312 = fStack_b54 * fVar235 + fStack_b64 * fVar296;
              auVar247._0_4_ =
                   fVar238 * ((float)local_b70._0_4_ * fVar232 + fVar238 * (float)local_b50._0_4_) +
                   fVar232 * fVar300;
              auVar247._4_4_ =
                   fVar277 * ((float)local_b70._4_4_ * fVar233 + fVar277 * (float)local_b50._4_4_) +
                   fVar233 * fVar304;
              auVar247._8_4_ =
                   fVar292 * (fStack_b68 * fVar234 + fVar292 * fStack_b48) + fVar234 * fVar308;
              auVar247._12_4_ =
                   fVar296 * (fStack_b64 * fVar235 + fVar296 * fStack_b44) + fVar235 * fVar312;
              auVar202._0_4_ =
                   fVar238 * fVar300 +
                   fVar232 * (fVar232 * (float)local_b80._0_4_ + (float)local_b60._0_4_ * fVar238);
              auVar202._4_4_ =
                   fVar277 * fVar304 +
                   fVar233 * (fVar233 * (float)local_b80._4_4_ + (float)local_b60._4_4_ * fVar277);
              auVar202._8_4_ =
                   fVar292 * fVar308 + fVar234 * (fVar234 * fStack_b78 + fStack_b58 * fVar292);
              auVar202._12_4_ =
                   fVar296 * fVar312 + fVar235 * (fVar235 * fStack_b74 + fStack_b54 * fVar296);
              auVar162 = vshufps_avx(auVar243,auVar243,0);
              auVar133._0_4_ = auVar162._0_4_ * (float)local_a10._0_4_ + 0.0;
              auVar133._4_4_ = auVar162._4_4_ * (float)local_a10._4_4_ + 0.0;
              auVar133._8_4_ = auVar162._8_4_ * fStack_a08 + 0.0;
              auVar133._12_4_ = auVar162._12_4_ * fStack_a04 + 0.0;
              auVar93._0_4_ = fVar238 * auVar247._0_4_ + fVar232 * auVar202._0_4_;
              auVar93._4_4_ = fVar277 * auVar247._4_4_ + fVar233 * auVar202._4_4_;
              auVar93._8_4_ = fVar292 * auVar247._8_4_ + fVar234 * auVar202._8_4_;
              auVar93._12_4_ = fVar296 * auVar247._12_4_ + fVar235 * auVar202._12_4_;
              local_9c0._0_16_ = auVar93;
              auVar162 = vsubps_avx(auVar133,auVar93);
              _local_b20 = auVar162;
              auVar162 = vdpps_avx(auVar162,auVar162,0x7f);
              fVar232 = auVar162._0_4_;
              if (fVar232 < 0.0) {
                fVar233 = sqrtf(fVar232);
                uVar77 = extraout_RAX_04;
              }
              else {
                auVar3 = vsqrtss_avx(auVar162,auVar162);
                fVar233 = auVar3._0_4_;
              }
              auVar3 = vsubps_avx(auVar202,auVar247);
              auVar283._0_4_ = auVar3._0_4_ * 3.0;
              auVar283._4_4_ = auVar3._4_4_ * 3.0;
              auVar283._8_4_ = auVar3._8_4_ * 3.0;
              auVar283._12_4_ = auVar3._12_4_ * 3.0;
              auVar3 = vshufps_avx(ZEXT416((uint)(fVar240 * 6.0)),ZEXT416((uint)(fVar240 * 6.0)),0);
              auVar90 = ZEXT416((uint)((fVar236 - (fVar240 + fVar240)) * 6.0));
              auVar159 = vshufps_avx(auVar90,auVar90,0);
              auVar90 = ZEXT416((uint)((fVar240 - (fVar236 + fVar236)) * 6.0));
              auVar196 = vshufps_avx(auVar90,auVar90,0);
              auVar4 = vshufps_avx(ZEXT416((uint)(fVar236 * 6.0)),ZEXT416((uint)(fVar236 * 6.0)),0);
              auVar90 = vdpps_avx(auVar283,auVar283,0x7f);
              auVar134._0_4_ =
                   auVar4._0_4_ * (float)local_b50._0_4_ +
                   auVar196._0_4_ * (float)local_b70._0_4_ +
                   auVar3._0_4_ * (float)local_b80._0_4_ + auVar159._0_4_ * (float)local_b60._0_4_;
              auVar134._4_4_ =
                   auVar4._4_4_ * (float)local_b50._4_4_ +
                   auVar196._4_4_ * (float)local_b70._4_4_ +
                   auVar3._4_4_ * (float)local_b80._4_4_ + auVar159._4_4_ * (float)local_b60._4_4_;
              auVar134._8_4_ =
                   auVar4._8_4_ * fStack_b48 +
                   auVar196._8_4_ * fStack_b68 +
                   auVar3._8_4_ * fStack_b78 + auVar159._8_4_ * fStack_b58;
              auVar134._12_4_ =
                   auVar4._12_4_ * fStack_b44 +
                   auVar196._12_4_ * fStack_b64 +
                   auVar3._12_4_ * fStack_b74 + auVar159._12_4_ * fStack_b54;
              auVar3 = vblendps_avx(auVar90,_DAT_01f45a50,0xe);
              auVar159 = vrsqrtss_avx(auVar3,auVar3);
              fVar235 = auVar159._0_4_;
              fVar234 = auVar90._0_4_;
              auVar159 = vdpps_avx(auVar283,auVar134,0x7f);
              auVar196 = vshufps_avx(auVar90,auVar90,0);
              auVar135._0_4_ = auVar134._0_4_ * auVar196._0_4_;
              auVar135._4_4_ = auVar134._4_4_ * auVar196._4_4_;
              auVar135._8_4_ = auVar134._8_4_ * auVar196._8_4_;
              auVar135._12_4_ = auVar134._12_4_ * auVar196._12_4_;
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              auVar219._0_4_ = auVar283._0_4_ * auVar159._0_4_;
              auVar219._4_4_ = auVar283._4_4_ * auVar159._4_4_;
              auVar219._8_4_ = auVar283._8_4_ * auVar159._8_4_;
              auVar219._12_4_ = auVar283._12_4_ * auVar159._12_4_;
              auVar4 = vsubps_avx(auVar135,auVar219);
              auVar159 = vrcpss_avx(auVar3,auVar3);
              auVar3 = vmaxss_avx(ZEXT416((uint)local_b00._0_4_),
                                  ZEXT416((uint)(auVar243._0_4_ * (float)local_9a0._0_4_)));
              auVar159 = ZEXT416((uint)(auVar159._0_4_ * (2.0 - fVar234 * auVar159._0_4_)));
              auVar159 = vshufps_avx(auVar159,auVar159,0);
              uVar70 = CONCAT44(auVar283._4_4_,auVar283._0_4_);
              auVar248._0_8_ = uVar70 ^ 0x8000000080000000;
              auVar248._8_4_ = -auVar283._8_4_;
              auVar248._12_4_ = -auVar283._12_4_;
              auVar196 = ZEXT416((uint)(fVar235 * 1.5 + fVar234 * -0.5 * fVar235 * fVar235 * fVar235
                                       ));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              auVar203._0_4_ = auVar196._0_4_ * auVar4._0_4_ * auVar159._0_4_;
              auVar203._4_4_ = auVar196._4_4_ * auVar4._4_4_ * auVar159._4_4_;
              auVar203._8_4_ = auVar196._8_4_ * auVar4._8_4_ * auVar159._8_4_;
              auVar203._12_4_ = auVar196._12_4_ * auVar4._12_4_ * auVar159._12_4_;
              auVar318._0_4_ = auVar283._0_4_ * auVar196._0_4_;
              auVar318._4_4_ = auVar283._4_4_ * auVar196._4_4_;
              auVar318._8_4_ = auVar283._8_4_ * auVar196._8_4_;
              auVar318._12_4_ = auVar283._12_4_ * auVar196._12_4_;
              if (fVar234 < 0.0) {
                local_a60._0_16_ = auVar318;
                local_a80._0_16_ = auVar203;
                fVar234 = sqrtf(fVar234);
                uVar77 = extraout_RAX_05;
                auVar203 = local_a80._0_16_;
                auVar318 = local_a60._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar90,auVar90);
                fVar234 = auVar90._0_4_;
              }
              auVar90 = vdpps_avx(_local_b20,auVar318,0x7f);
              fVar233 = ((float)local_b00._0_4_ / fVar234) * (fVar233 + 1.0) +
                        auVar3._0_4_ + fVar233 * (float)local_b00._0_4_;
              auVar159 = vdpps_avx(auVar248,auVar318,0x7f);
              auVar196 = vdpps_avx(_local_b20,auVar203,0x7f);
              auVar4 = vdpps_avx(_local_a10,auVar318,0x7f);
              auVar5 = vdpps_avx(_local_b20,auVar248,0x7f);
              fVar234 = auVar159._0_4_ + auVar196._0_4_;
              fVar235 = auVar90._0_4_;
              auVar94._0_4_ = fVar235 * fVar235;
              auVar94._4_4_ = auVar90._4_4_ * auVar90._4_4_;
              auVar94._8_4_ = auVar90._8_4_ * auVar90._8_4_;
              auVar94._12_4_ = auVar90._12_4_ * auVar90._12_4_;
              auVar196 = vsubps_avx(auVar162,auVar94);
              auVar159 = vdpps_avx(_local_b20,_local_a10,0x7f);
              fVar236 = auVar5._0_4_ - fVar235 * fVar234;
              fVar238 = auVar159._0_4_ - fVar235 * auVar4._0_4_;
              auVar159 = vrsqrtss_avx(auVar196,auVar196);
              fVar277 = auVar196._0_4_;
              fVar235 = auVar159._0_4_;
              fVar235 = fVar235 * 1.5 + fVar277 * -0.5 * fVar235 * fVar235 * fVar235;
              if (fVar277 < 0.0) {
                local_a60._0_16_ = auVar4;
                local_a80._0_16_ = ZEXT416((uint)fVar234);
                local_9e0._0_4_ = fVar236;
                local_a00._0_4_ = fVar238;
                local_8c0._0_4_ = fVar235;
                fVar277 = sqrtf(fVar277);
                uVar77 = extraout_RAX_06;
                fVar235 = (float)local_8c0._0_4_;
                fVar236 = (float)local_9e0._0_4_;
                fVar238 = (float)local_a00._0_4_;
                auVar4 = local_a60._0_16_;
                auVar159 = local_a80._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar196,auVar196);
                fVar277 = auVar159._0_4_;
                auVar159 = ZEXT416((uint)fVar234);
              }
              auVar5 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar6 = vshufps_avx(auVar283,auVar283,0xff);
              fVar234 = fVar236 * fVar235 - auVar6._0_4_;
              auVar220._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar4._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar4._12_4_ ^ 0x80000000;
              auVar249._0_4_ = -fVar234;
              auVar249._4_4_ = 0x80000000;
              auVar249._8_4_ = 0x80000000;
              auVar249._12_4_ = 0x80000000;
              auVar196 = vinsertps_avx(auVar249,ZEXT416((uint)(fVar238 * fVar235)),0x1c);
              auVar4 = vmovsldup_avx(ZEXT416((uint)(auVar159._0_4_ * fVar238 * fVar235 -
                                                   auVar4._0_4_ * fVar234)));
              auVar196 = vdivps_avx(auVar196,auVar4);
              auVar159 = vinsertps_avx(auVar159,auVar220,0x10);
              auVar159 = vdivps_avx(auVar159,auVar4);
              auVar4 = vmovsldup_avx(auVar90);
              auVar92 = ZEXT416((uint)(fVar277 - auVar5._0_4_));
              auVar5 = vmovsldup_avx(auVar92);
              auVar165._0_4_ = auVar4._0_4_ * auVar196._0_4_ + auVar5._0_4_ * auVar159._0_4_;
              auVar165._4_4_ = auVar4._4_4_ * auVar196._4_4_ + auVar5._4_4_ * auVar159._4_4_;
              auVar165._8_4_ = auVar4._8_4_ * auVar196._8_4_ + auVar5._8_4_ * auVar159._8_4_;
              auVar165._12_4_ = auVar4._12_4_ * auVar196._12_4_ + auVar5._12_4_ * auVar159._12_4_;
              auVar243 = vsubps_avx(auVar243,auVar165);
              auVar166._8_4_ = 0x7fffffff;
              auVar166._0_8_ = 0x7fffffff7fffffff;
              auVar166._12_4_ = 0x7fffffff;
              auVar90 = vandps_avx(auVar90,auVar166);
              if (auVar90._0_4_ < fVar233) {
                auVar204._8_4_ = 0x7fffffff;
                auVar204._0_8_ = 0x7fffffff7fffffff;
                auVar204._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar92,auVar204);
                if (auVar90._0_4_ < (float)local_8e0._0_4_ * 1.9073486e-06 + auVar3._0_4_ + fVar233)
                {
                  bVar84 = uVar82 < 5;
                  fVar233 = auVar243._0_4_ + (float)local_980._0_4_;
                  auVar291 = ZEXT3264(local_a40);
                  if (fVar233 < fVar214) {
                    bVar75 = 0;
                    goto LAB_009dfc80;
                  }
                  fVar234 = *(float *)(ray + k * 4 + 0x100);
                  auVar264 = ZEXT3264(local_b40);
                  if (fVar233 <= fVar234) {
                    auVar3 = vmovshdup_avx(auVar243);
                    bVar75 = 0;
                    if ((auVar3._0_4_ < 0.0) || (1.0 < auVar3._0_4_)) goto LAB_009dfc89;
                    auVar162 = vrsqrtss_avx(auVar162,auVar162);
                    fVar235 = auVar162._0_4_;
                    pGVar8 = (context->scene->geometries).items[local_ab8].ptr;
                    if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar75 = 1, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_009dfc89;
                      auVar162 = ZEXT416((uint)(fVar235 * 1.5 +
                                               fVar232 * -0.5 * fVar235 * fVar235 * fVar235));
                      auVar162 = vshufps_avx(auVar162,auVar162,0);
                      auVar167._0_4_ = auVar162._0_4_ * (float)local_b20._0_4_;
                      auVar167._4_4_ = auVar162._4_4_ * (float)local_b20._4_4_;
                      auVar167._8_4_ = auVar162._8_4_ * fStack_b18;
                      auVar167._12_4_ = auVar162._12_4_ * fStack_b14;
                      auVar136._0_4_ = auVar283._0_4_ + auVar6._0_4_ * auVar167._0_4_;
                      auVar136._4_4_ = auVar283._4_4_ + auVar6._4_4_ * auVar167._4_4_;
                      auVar136._8_4_ = auVar283._8_4_ + auVar6._8_4_ * auVar167._8_4_;
                      auVar136._12_4_ = auVar283._12_4_ + auVar6._12_4_ * auVar167._12_4_;
                      auVar162 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar3 = vshufps_avx(auVar283,auVar283,0xc9);
                      auVar168._0_4_ = auVar3._0_4_ * auVar167._0_4_;
                      auVar168._4_4_ = auVar3._4_4_ * auVar167._4_4_;
                      auVar168._8_4_ = auVar3._8_4_ * auVar167._8_4_;
                      auVar168._12_4_ = auVar3._12_4_ * auVar167._12_4_;
                      auVar205._0_4_ = auVar283._0_4_ * auVar162._0_4_;
                      auVar205._4_4_ = auVar283._4_4_ * auVar162._4_4_;
                      auVar205._8_4_ = auVar283._8_4_ * auVar162._8_4_;
                      auVar205._12_4_ = auVar283._12_4_ * auVar162._12_4_;
                      auVar90 = vsubps_avx(auVar205,auVar168);
                      auVar162 = vshufps_avx(auVar90,auVar90,0xc9);
                      auVar3 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar206._0_4_ = auVar3._0_4_ * auVar162._0_4_;
                      auVar206._4_4_ = auVar3._4_4_ * auVar162._4_4_;
                      auVar206._8_4_ = auVar3._8_4_ * auVar162._8_4_;
                      auVar206._12_4_ = auVar3._12_4_ * auVar162._12_4_;
                      auVar162 = vshufps_avx(auVar90,auVar90,0xd2);
                      auVar137._0_4_ = auVar136._0_4_ * auVar162._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar162._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar162._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar162._12_4_;
                      auVar162 = vsubps_avx(auVar206,auVar137);
                      pRVar10 = context->user;
                      local_760 = vshufps_avx(auVar243,auVar243,0x55);
                      auStack_7b0 = vshufps_avx(auVar162,auVar162,0x55);
                      local_7a0 = vshufps_avx(auVar162,auVar162,0xaa);
                      local_780 = vshufps_avx(auVar162,auVar162,0);
                      local_7c0 = (RTCHitN  [16])auStack_7b0;
                      local_740 = ZEXT832(0) << 0x20;
                      local_720 = local_660._0_8_;
                      uStack_718 = local_660._8_8_;
                      uStack_710 = local_660._16_8_;
                      uStack_708 = local_660._24_8_;
                      local_700 = local_640;
                      auVar12 = vcmpps_avx(local_640,local_640,0xf);
                      local_ac0[1] = auVar12;
                      *local_ac0 = auVar12;
                      local_6e0 = pRVar10->instID[0];
                      local_6c0 = pRVar10->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar233;
                      local_ba0 = *local_ac8;
                      local_b90 = *local_ad0;
                      local_ab0.valid = (int *)local_ba0;
                      local_ab0.geometryUserPtr = pGVar8->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_7c0;
                      local_ab0.N = 8;
                      local_ab0.ray = (RTCRayN *)ray;
                      local_790 = local_7a0;
                      local_770 = local_780;
                      local_750 = local_760;
                      uStack_6dc = local_6e0;
                      uStack_6d8 = local_6e0;
                      uStack_6d4 = local_6e0;
                      uStack_6d0 = local_6e0;
                      uStack_6cc = local_6e0;
                      uStack_6c8 = local_6e0;
                      uStack_6c4 = local_6e0;
                      uStack_6bc = local_6c0;
                      uStack_6b8 = local_6c0;
                      uStack_6b4 = local_6c0;
                      uStack_6b0 = local_6c0;
                      uStack_6ac = local_6c0;
                      uStack_6a8 = local_6c0;
                      uStack_6a4 = local_6c0;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_ab0);
                        auVar291 = ZEXT3264(local_a40);
                      }
                      auVar243 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar162 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar177._16_16_ = auVar162;
                      auVar177._0_16_ = auVar243;
                      auVar12 = _DAT_01f7b020 & ~auVar177;
                      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar12 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar12 >> 0x7f,0) == '\0') &&
                            (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar12 >> 0xbf,0) == '\0') &&
                          (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar12[0x1f]) {
                        auVar264 = ZEXT3264(local_b40);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_ab0);
                          auVar291 = ZEXT3264(local_a40);
                        }
                        auVar243 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar162 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar112._16_16_ = auVar162;
                        auVar112._0_16_ = auVar243;
                        auVar153._8_4_ = 0xff800000;
                        auVar153._0_8_ = 0xff800000ff800000;
                        auVar153._12_4_ = 0xff800000;
                        auVar153._16_4_ = 0xff800000;
                        auVar153._20_4_ = 0xff800000;
                        auVar153._24_4_ = 0xff800000;
                        auVar153._28_4_ = 0xff800000;
                        auVar12 = vblendvps_avx(auVar153,*(undefined1 (*) [32])
                                                          (local_ab0.ray + 0x100),auVar112);
                        *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar12;
                        auVar12 = _DAT_01f7b020 & ~auVar112;
                        auVar264 = ZEXT3264(local_b40);
                        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar12 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar12 >> 0x7f,0) != '\0') ||
                              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar12 >> 0xbf,0) != '\0') ||
                            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar12[0x1f] < '\0') {
                          bVar75 = 1;
                          goto LAB_009dfc89;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar234;
                    }
                  }
                  bVar75 = 0;
                  goto LAB_009dfc89;
                }
              }
              auVar291 = ZEXT3264(local_a40);
            }
            bVar84 = false;
LAB_009dfc80:
            auVar264 = ZEXT3264(local_b40);
LAB_009dfc89:
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar333._4_4_ = uVar2;
            auVar333._0_4_ = uVar2;
            auVar333._8_4_ = uVar2;
            auVar333._12_4_ = uVar2;
            auVar333._16_4_ = uVar2;
            auVar333._20_4_ = uVar2;
            auVar333._24_4_ = uVar2;
            auVar333._28_4_ = uVar2;
            auVar334 = ZEXT3264(auVar333);
            bVar83 = bVar83 | bVar84 & bVar75;
            auVar12 = vcmpps_avx(_local_c20,auVar333,2);
          }
          auVar95 = vandps_avx(auVar264._0_32_,local_800);
          auVar12 = vandps_avx(local_940,_local_920);
          auVar178._0_4_ = (float)local_960._0_4_ + local_540._0_4_;
          auVar178._4_4_ = (float)local_960._4_4_ + local_540._4_4_;
          auVar178._8_4_ = fStack_958 + local_540._8_4_;
          auVar178._12_4_ = fStack_954 + local_540._12_4_;
          auVar178._16_4_ = fStack_950 + local_540._16_4_;
          auVar178._20_4_ = fStack_94c + local_540._20_4_;
          auVar178._24_4_ = fStack_948 + local_540._24_4_;
          auVar178._28_4_ = fStack_944 + local_540._28_4_;
          auVar243 = vshufps_avx(auVar334._0_16_,auVar334._0_16_,0);
          auVar231._16_16_ = auVar243;
          auVar231._0_16_ = auVar243;
          auVar225 = vcmpps_avx(auVar178,auVar231,2);
          auVar95 = vandps_avx(auVar225,auVar95);
          auVar262._0_4_ = (float)local_960._0_4_ + local_500._0_4_;
          auVar262._4_4_ = (float)local_960._4_4_ + local_500._4_4_;
          auVar262._8_4_ = fStack_958 + local_500._8_4_;
          auVar262._12_4_ = fStack_954 + local_500._12_4_;
          auVar262._16_4_ = fStack_950 + local_500._16_4_;
          auVar262._20_4_ = fStack_94c + local_500._20_4_;
          auVar262._24_4_ = fStack_948 + local_500._24_4_;
          auVar262._28_4_ = fStack_944 + local_500._28_4_;
          auVar225 = vcmpps_avx(auVar262,auVar231,2);
          auVar12 = vandps_avx(auVar225,auVar12);
          auVar12 = vorps_avx(auVar95,auVar12);
          fVar157 = (float)local_960._0_4_;
          fVar181 = (float)local_960._4_4_;
          fVar183 = fStack_958;
          fVar185 = fStack_954;
          fVar187 = fStack_950;
          fVar189 = fStack_94c;
          fVar191 = fStack_948;
          fVar280 = fStack_944;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0x7f,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0xbf,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar12;
            auVar95 = vblendvps_avx(_local_500,_local_540,auVar95);
            *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar95;
            uVar77 = vmovlps_avx(local_7d0);
            (&uStack_140)[uVar76 * 0xc] = uVar77;
            auStack_138[uVar76 * 0x18] = local_d04 + 1;
            uVar76 = (ulong)((int)uVar76 + 1);
          }
        }
      }
    }
    while( true ) {
      auVar286 = local_600;
      uVar81 = (uint)uVar76;
      if (uVar81 == 0) {
        if (bVar83 != 0) goto LAB_009e0382;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar114._4_4_ = uVar2;
        auVar114._0_4_ = uVar2;
        auVar114._8_4_ = uVar2;
        auVar114._12_4_ = uVar2;
        auVar114._16_4_ = uVar2;
        auVar114._20_4_ = uVar2;
        auVar114._24_4_ = uVar2;
        auVar114._28_4_ = uVar2;
        auVar95 = vcmpps_avx(local_460,auVar114,2);
        uVar81 = vmovmskps_avx(auVar95);
        uVar81 = (uint)local_968 - 1 & (uint)local_968 & uVar81;
        goto LAB_009dd975;
      }
      uVar76 = (ulong)(uVar81 - 1);
      lVar78 = uVar76 * 0x60;
      auVar95 = *(undefined1 (*) [32])(auStack_160 + lVar78);
      auVar113._0_4_ = fVar157 + auVar95._0_4_;
      auVar113._4_4_ = fVar181 + auVar95._4_4_;
      auVar113._8_4_ = fVar183 + auVar95._8_4_;
      auVar113._12_4_ = fVar185 + auVar95._12_4_;
      auVar113._16_4_ = fVar187 + auVar95._16_4_;
      auVar113._20_4_ = fVar189 + auVar95._20_4_;
      auVar113._24_4_ = fVar191 + auVar95._24_4_;
      auVar113._28_4_ = fVar280 + auVar95._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar212._4_4_ = uVar2;
      auVar212._0_4_ = uVar2;
      auVar212._8_4_ = uVar2;
      auVar212._12_4_ = uVar2;
      auVar212._16_4_ = uVar2;
      auVar212._20_4_ = uVar2;
      auVar212._24_4_ = uVar2;
      auVar212._28_4_ = uVar2;
      auVar12 = vcmpps_avx(auVar113,auVar212,2);
      _local_7c0 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar78));
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar78) & auVar12;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      uVar76 = (ulong)(uVar81 - 1);
    }
    auVar179._8_4_ = 0x7f800000;
    auVar179._0_8_ = 0x7f8000007f800000;
    auVar179._12_4_ = 0x7f800000;
    auVar179._16_4_ = 0x7f800000;
    auVar179._20_4_ = 0x7f800000;
    auVar179._24_4_ = 0x7f800000;
    auVar179._28_4_ = 0x7f800000;
    auVar95 = vblendvps_avx(auVar179,auVar95,_local_7c0);
    auVar12 = vshufps_avx(auVar95,auVar95,0xb1);
    auVar12 = vminps_avx(auVar95,auVar12);
    auVar225 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar225);
    auVar225 = vperm2f128_avx(auVar12,auVar12,1);
    auVar12 = vminps_avx(auVar12,auVar225);
    auVar12 = vcmpps_avx(auVar95,auVar12,0);
    auVar225 = _local_7c0 & auVar12;
    auVar95 = _local_7c0;
    if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar225 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar225 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar225 >> 0x7f,0) != '\0') ||
          (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar225 >> 0xbf,0) != '\0') ||
        (auVar225 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar225[0x1f] < '\0') {
      auVar95 = vandps_avx(auVar12,_local_7c0);
    }
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (&uStack_140)[uVar76 * 0xc];
    local_d04 = auStack_138[uVar76 * 0x18];
    uVar79 = vmovmskps_avx(auVar95);
    uVar80 = 0;
    if (uVar79 != 0) {
      for (; (uVar79 >> uVar80 & 1) == 0; uVar80 = uVar80 + 1) {
      }
    }
    *(undefined4 *)(local_7c0 + (ulong)uVar80 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar78) = _local_7c0;
    uVar79 = uVar81 - 1;
    if ((((((((_local_7c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7c0 >> 0x7f,0) != '\0') ||
          (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7c0 >> 0xbf,0) != '\0') ||
        (_local_7c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7c0[0x1f] < '\0') {
      uVar79 = uVar81;
    }
    auVar243 = vshufps_avx(auVar138,auVar138,0);
    auVar162 = vshufps_avx(auVar138,auVar138,0x55);
    auVar162 = vsubps_avx(auVar162,auVar243);
    local_540._4_4_ = auVar243._4_4_ + auVar162._4_4_ * 0.14285715;
    local_540._0_4_ = auVar243._0_4_ + auVar162._0_4_ * 0.0;
    fStack_538 = auVar243._8_4_ + auVar162._8_4_ * 0.2857143;
    fStack_534 = auVar243._12_4_ + auVar162._12_4_ * 0.42857146;
    fStack_530 = auVar243._0_4_ + auVar162._0_4_ * 0.5714286;
    fStack_52c = auVar243._4_4_ + auVar162._4_4_ * 0.71428573;
    fStack_528 = auVar243._8_4_ + auVar162._8_4_ * 0.8571429;
    fStack_524 = auVar243._12_4_ + auVar162._12_4_;
    local_7d0._8_8_ = 0;
    local_7d0._0_8_ = *(ulong *)(local_540 + (ulong)uVar80 * 4);
    uVar76 = (ulong)uVar79;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }